

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  ImDrawListFlags *pIVar1;
  ImGuiWindow **ppIVar2;
  bool *pbVar3;
  int *piVar4;
  ImS8 *pIVar5;
  float *pfVar6;
  ImRect *pIVar7;
  ImVec2 *pIVar8;
  ImU16 *pIVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ImVec2 IVar13;
  ImVec2 IVar14;
  double dVar15;
  ImVec2 IVar16;
  ImGuiID IVar17;
  ImGuiContextHook *pIVar18;
  char *pcVar19;
  uint *puVar20;
  ImGuiViewportP *pIVar21;
  ImGuiTableTempData *pIVar22;
  ImGuiWindowStackData *pIVar23;
  ImGuiPopupData *pIVar24;
  int *piVar25;
  ImGuiGroupData *pIVar26;
  ImGuiStackLevelInfo *pIVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  ImRect IVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  ImVec4 IVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  ImGuiContext *pIVar48;
  ImGuiContext *pIVar49;
  ImGuiContext *pIVar50;
  ImGuiContext *pIVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  uint uVar55;
  ImGuiContext *g_6;
  uint *__dest;
  ImGuiWindow *pIVar56;
  ImGuiWindowStackData *__dest_00;
  ImGuiPopupData *__dest_01;
  int *piVar57;
  ImGuiGroupData *__dest_02;
  ImGuiStackLevelInfo *__dest_03;
  int i;
  uint uVar58;
  int iVar59;
  ImGuiScrollFlags scroll_flags;
  ImGuiWindow *pIVar60;
  ImGuiWindow *window;
  byte bVar61;
  int i_1;
  ImGuiContext *g;
  int iVar62;
  ImGuiID IVar63;
  ImGuiNavLayer IVar64;
  ImFont *font;
  long lVar65;
  ImGuiContext *g_2;
  ImGuiContext *g_1;
  long lVar66;
  ImGuiWindow *old_nav_window;
  long lVar67;
  bool bVar68;
  bool bVar69;
  byte bVar70;
  byte bVar71;
  ushort uVar72;
  ulong uVar73;
  undefined1 auVar74 [16];
  ImVec4 IVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar92 [48];
  undefined1 auVar90 [64];
  float fVar93;
  float fVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  float fVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar126;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 local_78 [16];
  undefined1 local_58 [16];
  ImVec2 local_38;
  undefined1 auVar91 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  pIVar48 = GImGui;
  lVar66 = (long)(GImGui->Hooks).Size;
  if (0 < lVar66) {
    lVar67 = -lVar66;
    lVar65 = lVar66 + 1;
    lVar66 = lVar66 * 0x20;
    do {
      pIVar18 = (pIVar48->Hooks).Data;
      if (*(int *)(pIVar18 + lVar66 + -0x1c) == 7) {
        memmove(pIVar18 + lVar66 + -0x20,pIVar18 + lVar66,((pIVar48->Hooks).Size + lVar67) * 0x20);
        (pIVar48->Hooks).Size = (pIVar48->Hooks).Size + -1;
      }
      lVar67 = lVar67 + 1;
      lVar65 = lVar65 + -1;
      lVar66 = lVar66 + -0x20;
    } while (1 < lVar65);
  }
  if (0 < (pIVar48->Hooks).Size) {
    lVar66 = 0;
    lVar65 = 0;
    do {
      pIVar18 = (pIVar48->Hooks).Data;
      if (*(int *)(pIVar18 + lVar66 + 4) == 0) {
        (**(code **)(pIVar18 + lVar66 + 0x10))(pIVar48,pIVar18 + lVar66);
      }
      lVar65 = lVar65 + 1;
      lVar66 = lVar66 + 0x20;
    } while (lVar65 < (pIVar48->Hooks).Size);
  }
  pIVar49 = GImGui;
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar49->SettingsLoaded == false) {
    pcVar19 = (pIVar49->IO).IniFilename;
    if (pcVar19 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar19);
    }
    pIVar49->SettingsLoaded = true;
  }
  if ((0.0 < pIVar49->SettingsDirtyTimer) &&
     (fVar118 = pIVar49->SettingsDirtyTimer - (pIVar49->IO).DeltaTime,
     pIVar49->SettingsDirtyTimer = fVar118, fVar118 <= 0.0)) {
    pcVar19 = (pIVar49->IO).IniFilename;
    if (pcVar19 == (char *)0x0) {
      (pIVar49->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar19);
    }
    pIVar49->SettingsDirtyTimer = 0.0;
  }
  pIVar48->Time = (double)(pIVar48->IO).DeltaTime + pIVar48->Time;
  pIVar48->WithinFrameScope = true;
  pIVar48->FrameCount = pIVar48->FrameCount + 1;
  pIVar48->TooltipOverrideCount = 0;
  pIVar48->WindowsActiveCount = 0;
  iVar62 = (pIVar48->MenusIdSubmittedThisFrame).Capacity;
  if (iVar62 < 0) {
    uVar58 = iVar62 / 2 + iVar62;
    uVar58 = ~((int)uVar58 >> 0x1f) & uVar58;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar25 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar25 = *piVar25 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)((ulong)uVar58 * 4,GImAllocatorUserData);
    puVar20 = (pIVar48->MenusIdSubmittedThisFrame).Data;
    if (puVar20 != (uint *)0x0) {
      memcpy(__dest,puVar20,(long)(pIVar48->MenusIdSubmittedThisFrame).Size << 2);
      puVar20 = (pIVar48->MenusIdSubmittedThisFrame).Data;
      if ((puVar20 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar25 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar25 = *piVar25 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar20,GImAllocatorUserData);
    }
    (pIVar48->MenusIdSubmittedThisFrame).Data = __dest;
    (pIVar48->MenusIdSubmittedThisFrame).Capacity = uVar58;
  }
  (pIVar48->MenusIdSubmittedThisFrame).Size = 0;
  fVar118 = (pIVar48->IO).DeltaTime;
  iVar62 = pIVar48->FramerateSecPerFrameIdx;
  pIVar48->FramerateSecPerFrameAccum =
       (fVar118 - pIVar48->FramerateSecPerFrame[iVar62]) + pIVar48->FramerateSecPerFrameAccum;
  pIVar48->FramerateSecPerFrame[iVar62] = fVar118;
  iVar59 = (int)((ulong)((long)(iVar62 + 1) * -0x77777777) >> 0x20) + 1 + iVar62;
  pIVar48->FramerateSecPerFrameIdx = iVar62 + 1 + ((iVar59 >> 6) - (iVar59 >> 0x1f)) * -0x78;
  iVar62 = 0x77;
  if (pIVar48->FramerateSecPerFrameCount < 0x77) {
    iVar62 = pIVar48->FramerateSecPerFrameCount;
  }
  pIVar48->FramerateSecPerFrameCount = iVar62 + 1;
  auVar76._0_12_ = ZEXT812(0);
  auVar76._12_4_ = 0;
  uVar40 = vcmpss_avx512f(auVar76,ZEXT416((uint)pIVar48->FramerateSecPerFrameAccum),1);
  bVar68 = (bool)((byte)uVar40 & 1);
  fVar118 = 3.4028235e+38;
  (pIVar48->IO).Framerate =
       (float)((uint)bVar68 *
               (int)(1.0 / (pIVar48->FramerateSecPerFrameAccum / (float)(iVar62 + 1))) +
              (uint)!bVar68 * 0x7f7fffff);
  pIVar49 = GImGui;
  pIVar21 = *(GImGui->Viewports).Data;
  (pIVar21->super_ImGuiViewport).Flags = 5;
  (pIVar21->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar21->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar21->super_ImGuiViewport).Size = (pIVar49->IO).DisplaySize;
  if (0 < (pIVar49->Viewports).Size) {
    lVar66 = 0;
    auVar76 = ZEXT816(0);
    do {
      pIVar21 = (pIVar49->Viewports).Data[lVar66];
      pIVar21->WorkOffsetMin = pIVar21->BuildWorkOffsetMin;
      pIVar21->WorkOffsetMax = pIVar21->BuildWorkOffsetMax;
      (pIVar21->BuildWorkOffsetMin).x = (float)(int)auVar76._0_8_;
      (pIVar21->BuildWorkOffsetMin).y = (float)(int)((ulong)auVar76._0_8_ >> 0x20);
      (pIVar21->BuildWorkOffsetMax).x = (float)(int)auVar76._8_8_;
      (pIVar21->BuildWorkOffsetMax).y = (float)(int)((ulong)auVar76._8_8_ >> 0x20);
      IVar13 = (pIVar21->super_ImGuiViewport).Pos;
      auVar127._8_8_ = 0;
      auVar127._0_4_ = (pIVar21->super_ImGuiViewport).Size.x;
      auVar127._4_4_ = (pIVar21->super_ImGuiViewport).Size.y;
      IVar14 = pIVar21->WorkOffsetMin;
      auVar135._8_8_ = 0;
      auVar135._0_4_ = IVar14.x;
      auVar135._4_4_ = IVar14.y;
      auVar119._0_4_ = IVar13.x + IVar14.x;
      auVar119._4_4_ = IVar13.y + IVar14.y;
      auVar119._8_8_ = 0;
      auVar74 = vsubps_avx(auVar127,auVar135);
      auVar128._0_4_ = auVar74._0_4_ + (pIVar21->WorkOffsetMax).x;
      auVar128._4_4_ = auVar74._4_4_ + (pIVar21->WorkOffsetMax).y;
      auVar128._8_4_ = auVar74._8_4_ + 0.0;
      auVar128._12_4_ = auVar74._12_4_ + 0.0;
      uVar73 = vcmpps_avx512vl(auVar128,auVar76,6);
      auVar74._4_4_ = (uint)((byte)(uVar73 >> 1) & 1) * (int)auVar128._4_4_;
      auVar74._0_4_ = (uint)((byte)uVar73 & 1) * (int)auVar128._0_4_;
      auVar74._8_4_ = (uint)((byte)(uVar73 >> 2) & 1) * (int)auVar128._8_4_;
      auVar74._12_4_ = (uint)((byte)(uVar73 >> 3) & 1) * (int)auVar128._12_4_;
      auVar74 = vmovlhps_avx(auVar119,auVar74);
      (pIVar21->super_ImGuiViewport).WorkPos.x = (float)(int)auVar74._0_8_;
      (pIVar21->super_ImGuiViewport).WorkPos.y = (float)(int)((ulong)auVar74._0_8_ >> 0x20);
      (pIVar21->super_ImGuiViewport).WorkSize.x = (float)(int)auVar74._8_8_;
      (pIVar21->super_ImGuiViewport).WorkSize.y = (float)(int)((ulong)auVar74._8_8_ >> 0x20);
      lVar66 = lVar66 + 1;
    } while (lVar66 < (pIVar49->Viewports).Size);
  }
  ((pIVar48->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    font = *(((GImGui->IO).Fonts)->Fonts).Data;
  }
  SetCurrentFont(font);
  lVar66 = (long)(pIVar48->Viewports).Size;
  IVar75 = _DAT_005478c0;
  if (0 < lVar66) {
    lVar65 = 0;
    IVar44 = _DAT_005478c0;
    do {
      pIVar21 = (pIVar48->Viewports).Data[lVar65];
      IVar13 = (pIVar21->super_ImGuiViewport).Pos;
      auVar120._8_8_ = 0;
      auVar120._0_4_ = IVar13.x;
      auVar120._4_4_ = IVar13.y;
      IVar14 = (pIVar21->super_ImGuiViewport).Size;
      auVar129._0_4_ = IVar13.x + IVar14.x;
      auVar129._4_4_ = IVar13.y + IVar14.y;
      auVar129._8_8_ = 0;
      auVar76 = vmovlhps_avx(auVar120,auVar129);
      uVar40 = vcmpps_avx512vl(auVar76,(undefined1  [16])IVar44,1);
      uVar37 = vcmpps_avx512vl((undefined1  [16])IVar44,auVar76,1);
      auVar74 = vpmovm2d_avx512vl(uVar37);
      auVar119 = vpmovm2d_avx512vl(uVar40);
      auVar74 = vpblendd_avx2(auVar119,auVar74,0xc);
      uVar73 = vpmovd2m_avx512vl(auVar74);
      bVar68 = (bool)((byte)uVar73 & 1);
      IVar75.x = (uint)bVar68 * auVar76._0_4_ | (uint)!bVar68 * (int)IVar44.x;
      bVar68 = (bool)((byte)(uVar73 >> 1) & 1);
      IVar75.y = (uint)bVar68 * auVar76._4_4_ | (uint)!bVar68 * (int)IVar44.y;
      bVar68 = (bool)((byte)(uVar73 >> 2) & 1);
      IVar75.z = (uint)bVar68 * auVar76._8_4_ | (uint)!bVar68 * (int)IVar44.z;
      bVar68 = (bool)((byte)(uVar73 >> 3) & 1);
      IVar75.w = (float)((uint)bVar68 * auVar76._12_4_ | (uint)!bVar68 * (int)IVar44.w);
      lVar65 = lVar65 + 1;
      IVar44 = IVar75;
    } while (lVar66 != lVar65);
  }
  (pIVar48->DrawListSharedData).ClipRectFullscreen = IVar75;
  fVar93 = (pIVar48->Style).CircleTessellationMaxError;
  (pIVar48->DrawListSharedData).CurveTessellationTol = (pIVar48->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError(&pIVar48->DrawListSharedData,fVar93);
  uVar58 = (uint)(pIVar48->Style).AntiAliasedLines;
  (pIVar48->DrawListSharedData).InitialFlags = uVar58;
  if (((pIVar48->Style).AntiAliasedLinesUseTex != false) &&
     ((pIVar48->Font->ContainerAtlas->Flags & 4) == 0)) {
    (pIVar48->DrawListSharedData).InitialFlags = uVar58 | 2;
  }
  if ((pIVar48->Style).AntiAliasedFill == true) {
    pIVar1 = &(pIVar48->DrawListSharedData).InitialFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  if (((pIVar48->IO).BackendFlags & 8) != 0) {
    pIVar1 = &(pIVar48->DrawListSharedData).InitialFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 8;
  }
  if (0 < (pIVar48->Viewports).Size) {
    lVar66 = 0;
    do {
      pIVar21 = (pIVar48->Viewports).Data[lVar66];
      (pIVar21->DrawDataP).CmdLists = (ImDrawList **)0x0;
      (pIVar21->DrawDataP).DisplayPos.x = 0.0;
      (pIVar21->DrawDataP).DisplayPos.y = 0.0;
      (pIVar21->DrawDataP).DisplaySize.x = 0.0;
      (pIVar21->DrawDataP).DisplaySize.y = 0.0;
      (pIVar21->DrawDataP).FramebufferScale.x = 0.0;
      (pIVar21->DrawDataP).FramebufferScale.y = 0.0;
      (pIVar21->DrawDataP).Valid = false;
      *(undefined3 *)&(pIVar21->DrawDataP).field_0x1 = 0;
      (pIVar21->DrawDataP).CmdListsCount = 0;
      (pIVar21->DrawDataP).TotalIdxCount = 0;
      (pIVar21->DrawDataP).TotalVtxCount = 0;
      (pIVar21->DrawDataP).CmdLists = (ImDrawList **)0x0;
      (pIVar21->DrawDataP).DisplayPos.x = 0.0;
      (pIVar21->DrawDataP).DisplayPos.y = 0.0;
      lVar66 = lVar66 + 1;
    } while (lVar66 < (pIVar48->Viewports).Size);
  }
  pIVar49 = GImGui;
  if ((pIVar48->DragDropActive != false) &&
     (IVar63 = (pIVar48->DragDropPayload).SourceId, IVar63 == pIVar48->ActiveId)) {
    if (GImGui->ActiveId == IVar63) {
      GImGui->ActiveIdIsAlive = IVar63;
    }
    if (pIVar49->ActiveIdPreviousFrame == IVar63) {
      pIVar49->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar48->HoveredIdPreviousFrame == 0) {
    pIVar48->HoveredIdTimer = 0.0;
LAB_002b747a:
    pIVar48->HoveredIdNotActiveTimer = 0.0;
  }
  else if ((pIVar48->HoveredId != 0) && (pIVar48->ActiveId == pIVar48->HoveredId))
  goto LAB_002b747a;
  IVar63 = pIVar48->HoveredId;
  if ((IVar63 != 0) &&
     (pIVar48->HoveredIdTimer = (pIVar48->IO).DeltaTime + pIVar48->HoveredIdTimer,
     pIVar48->ActiveId != IVar63)) {
    pIVar48->HoveredIdNotActiveTimer = (pIVar48->IO).DeltaTime + pIVar48->HoveredIdNotActiveTimer;
  }
  pIVar48->HoveredIdPreviousFrame = IVar63;
  pIVar48->HoveredIdPreviousFrameUsingMouseWheel = pIVar48->HoveredIdUsingMouseWheel;
  pIVar48->HoveredId = 0;
  pIVar48->HoveredIdAllowOverlap = false;
  pIVar48->HoveredIdUsingMouseWheel = false;
  pIVar48->HoveredIdDisabled = false;
  IVar63 = pIVar48->ActiveId;
  if (((pIVar48->ActiveIdIsAlive != IVar63) && (IVar63 != 0)) &&
     (pIVar48->ActiveIdPreviousFrame == IVar63)) {
    ClearActiveID();
  }
  IVar63 = pIVar48->ActiveId;
  if (IVar63 != 0) {
    pIVar48->ActiveIdTimer = (pIVar48->IO).DeltaTime + pIVar48->ActiveIdTimer;
  }
  pIVar48->LastActiveIdTimer = (pIVar48->IO).DeltaTime + pIVar48->LastActiveIdTimer;
  pIVar48->ActiveIdPreviousFrame = IVar63;
  pIVar48->ActiveIdPreviousFrameWindow = pIVar48->ActiveIdWindow;
  pIVar48->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar48->ActiveIdHasBeenEditedBefore;
  pIVar48->ActiveIdIsAlive = 0;
  pIVar48->ActiveIdHasBeenEditedThisFrame = false;
  pIVar48->ActiveIdPreviousFrameIsAlive = false;
  pIVar48->ActiveIdIsJustActivated = false;
  if (IVar63 != pIVar48->TempInputId && pIVar48->TempInputId != 0) {
    pIVar48->TempInputId = 0;
  }
  if (IVar63 == 0) {
    auVar95._0_12_ = ZEXT812(0);
    auVar95._12_4_ = 0;
    pIVar48->ActiveIdUsingNavDirMask = auVar95._0_4_;
    pIVar48->ActiveIdUsingNavInputMask = auVar95._4_4_;
    pIVar48->ActiveIdUsingKeyInputMask = auVar95._8_8_;
  }
  pIVar48->DragDropAcceptIdPrev = pIVar48->DragDropAcceptIdCurr;
  pIVar48->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar48->DragDropAcceptIdCurr = 0;
  pIVar48->DragDropWithinSource = false;
  pIVar48->DragDropWithinTarget = false;
  pIVar48->DragDropHoldJustPressedId = 0;
  if ((pIVar48->IO).AppFocusLost == true) {
    (pIVar48->IO).KeysDown[0x1c0] = false;
    (pIVar48->IO).KeysDown[0x1c1] = false;
    (pIVar48->IO).KeysDown[0x1c2] = false;
    (pIVar48->IO).KeysDown[0x1c3] = false;
    (pIVar48->IO).KeysDown[0x1c4] = false;
    (pIVar48->IO).KeysDown[0x1c5] = false;
    (pIVar48->IO).KeysDown[0x1c6] = false;
    (pIVar48->IO).KeysDown[0x1c7] = false;
    (pIVar48->IO).KeysDown[0x1c8] = false;
    (pIVar48->IO).KeysDown[0x1c9] = false;
    (pIVar48->IO).KeysDown[0x1ca] = false;
    (pIVar48->IO).KeysDown[0x1cb] = false;
    (pIVar48->IO).KeysDown[0x1cc] = false;
    (pIVar48->IO).KeysDown[0x1cd] = false;
    (pIVar48->IO).KeysDown[0x1ce] = false;
    (pIVar48->IO).KeysDown[0x1cf] = false;
    (pIVar48->IO).KeysDown[0x1d0] = false;
    (pIVar48->IO).KeysDown[0x1d1] = false;
    (pIVar48->IO).KeysDown[0x1d2] = false;
    (pIVar48->IO).KeysDown[0x1d3] = false;
    (pIVar48->IO).KeysDown[0x1d4] = false;
    (pIVar48->IO).KeysDown[0x1d5] = false;
    (pIVar48->IO).KeysDown[0x1d6] = false;
    (pIVar48->IO).KeysDown[0x1d7] = false;
    (pIVar48->IO).KeysDown[0x1d8] = false;
    (pIVar48->IO).KeysDown[0x1d9] = false;
    (pIVar48->IO).KeysDown[0x1da] = false;
    (pIVar48->IO).KeysDown[0x1db] = false;
    (pIVar48->IO).KeysDown[0x1dc] = false;
    (pIVar48->IO).KeysDown[0x1dd] = false;
    (pIVar48->IO).KeysDown[0x1de] = false;
    (pIVar48->IO).KeysDown[0x1df] = false;
    (pIVar48->IO).KeysDown[0x1e0] = false;
    (pIVar48->IO).KeysDown[0x1e1] = false;
    (pIVar48->IO).KeysDown[0x1e2] = false;
    (pIVar48->IO).KeysDown[0x1e3] = false;
    (pIVar48->IO).KeysDown[0x1e4] = false;
    (pIVar48->IO).KeysDown[0x1e5] = false;
    (pIVar48->IO).KeysDown[0x1e6] = false;
    (pIVar48->IO).KeysDown[0x1e7] = false;
    (pIVar48->IO).KeysDown[0x1e8] = false;
    (pIVar48->IO).KeysDown[0x1e9] = false;
    (pIVar48->IO).KeysDown[0x1ea] = false;
    (pIVar48->IO).KeysDown[0x1eb] = false;
    (pIVar48->IO).KeysDown[0x1ec] = false;
    (pIVar48->IO).KeysDown[0x1ed] = false;
    (pIVar48->IO).KeysDown[0x1ee] = false;
    (pIVar48->IO).KeysDown[0x1ef] = false;
    (pIVar48->IO).KeysDown[0x1f0] = false;
    (pIVar48->IO).KeysDown[0x1f1] = false;
    (pIVar48->IO).KeysDown[0x1f2] = false;
    (pIVar48->IO).KeysDown[499] = false;
    (pIVar48->IO).KeysDown[500] = false;
    (pIVar48->IO).KeysDown[0x1f5] = false;
    (pIVar48->IO).KeysDown[0x1f6] = false;
    (pIVar48->IO).KeysDown[0x1f7] = false;
    (pIVar48->IO).KeysDown[0x1f8] = false;
    (pIVar48->IO).KeysDown[0x1f9] = false;
    (pIVar48->IO).KeysDown[0x1fa] = false;
    (pIVar48->IO).KeysDown[0x1fb] = false;
    (pIVar48->IO).KeysDown[0x1fc] = false;
    (pIVar48->IO).KeysDown[0x1fd] = false;
    (pIVar48->IO).KeysDown[0x1fe] = false;
    (pIVar48->IO).KeysDown[0x1ff] = false;
    (pIVar48->IO).KeysDown[0x180] = false;
    (pIVar48->IO).KeysDown[0x181] = false;
    (pIVar48->IO).KeysDown[0x182] = false;
    (pIVar48->IO).KeysDown[0x183] = false;
    (pIVar48->IO).KeysDown[0x184] = false;
    (pIVar48->IO).KeysDown[0x185] = false;
    (pIVar48->IO).KeysDown[0x186] = false;
    (pIVar48->IO).KeysDown[0x187] = false;
    (pIVar48->IO).KeysDown[0x188] = false;
    (pIVar48->IO).KeysDown[0x189] = false;
    (pIVar48->IO).KeysDown[0x18a] = false;
    (pIVar48->IO).KeysDown[0x18b] = false;
    (pIVar48->IO).KeysDown[0x18c] = false;
    (pIVar48->IO).KeysDown[0x18d] = false;
    (pIVar48->IO).KeysDown[0x18e] = false;
    (pIVar48->IO).KeysDown[399] = false;
    (pIVar48->IO).KeysDown[400] = false;
    (pIVar48->IO).KeysDown[0x191] = false;
    (pIVar48->IO).KeysDown[0x192] = false;
    (pIVar48->IO).KeysDown[0x193] = false;
    (pIVar48->IO).KeysDown[0x194] = false;
    (pIVar48->IO).KeysDown[0x195] = false;
    (pIVar48->IO).KeysDown[0x196] = false;
    (pIVar48->IO).KeysDown[0x197] = false;
    (pIVar48->IO).KeysDown[0x198] = false;
    (pIVar48->IO).KeysDown[0x199] = false;
    (pIVar48->IO).KeysDown[0x19a] = false;
    (pIVar48->IO).KeysDown[0x19b] = false;
    (pIVar48->IO).KeysDown[0x19c] = false;
    (pIVar48->IO).KeysDown[0x19d] = false;
    (pIVar48->IO).KeysDown[0x19e] = false;
    (pIVar48->IO).KeysDown[0x19f] = false;
    (pIVar48->IO).KeysDown[0x1a0] = false;
    (pIVar48->IO).KeysDown[0x1a1] = false;
    (pIVar48->IO).KeysDown[0x1a2] = false;
    (pIVar48->IO).KeysDown[0x1a3] = false;
    (pIVar48->IO).KeysDown[0x1a4] = false;
    (pIVar48->IO).KeysDown[0x1a5] = false;
    (pIVar48->IO).KeysDown[0x1a6] = false;
    (pIVar48->IO).KeysDown[0x1a7] = false;
    (pIVar48->IO).KeysDown[0x1a8] = false;
    (pIVar48->IO).KeysDown[0x1a9] = false;
    (pIVar48->IO).KeysDown[0x1aa] = false;
    (pIVar48->IO).KeysDown[0x1ab] = false;
    (pIVar48->IO).KeysDown[0x1ac] = false;
    (pIVar48->IO).KeysDown[0x1ad] = false;
    (pIVar48->IO).KeysDown[0x1ae] = false;
    (pIVar48->IO).KeysDown[0x1af] = false;
    (pIVar48->IO).KeysDown[0x1b0] = false;
    (pIVar48->IO).KeysDown[0x1b1] = false;
    (pIVar48->IO).KeysDown[0x1b2] = false;
    (pIVar48->IO).KeysDown[0x1b3] = false;
    (pIVar48->IO).KeysDown[0x1b4] = false;
    (pIVar48->IO).KeysDown[0x1b5] = false;
    (pIVar48->IO).KeysDown[0x1b6] = false;
    (pIVar48->IO).KeysDown[0x1b7] = false;
    (pIVar48->IO).KeysDown[0x1b8] = false;
    (pIVar48->IO).KeysDown[0x1b9] = false;
    (pIVar48->IO).KeysDown[0x1ba] = false;
    (pIVar48->IO).KeysDown[0x1bb] = false;
    (pIVar48->IO).KeysDown[0x1bc] = false;
    (pIVar48->IO).KeysDown[0x1bd] = false;
    (pIVar48->IO).KeysDown[0x1be] = false;
    (pIVar48->IO).KeysDown[0x1bf] = false;
    (pIVar48->IO).KeysDown[0x140] = false;
    (pIVar48->IO).KeysDown[0x141] = false;
    (pIVar48->IO).KeysDown[0x142] = false;
    (pIVar48->IO).KeysDown[0x143] = false;
    (pIVar48->IO).KeysDown[0x144] = false;
    (pIVar48->IO).KeysDown[0x145] = false;
    (pIVar48->IO).KeysDown[0x146] = false;
    (pIVar48->IO).KeysDown[0x147] = false;
    (pIVar48->IO).KeysDown[0x148] = false;
    (pIVar48->IO).KeysDown[0x149] = false;
    (pIVar48->IO).KeysDown[0x14a] = false;
    (pIVar48->IO).KeysDown[0x14b] = false;
    (pIVar48->IO).KeysDown[0x14c] = false;
    (pIVar48->IO).KeysDown[0x14d] = false;
    (pIVar48->IO).KeysDown[0x14e] = false;
    (pIVar48->IO).KeysDown[0x14f] = false;
    (pIVar48->IO).KeysDown[0x150] = false;
    (pIVar48->IO).KeysDown[0x151] = false;
    (pIVar48->IO).KeysDown[0x152] = false;
    (pIVar48->IO).KeysDown[0x153] = false;
    (pIVar48->IO).KeysDown[0x154] = false;
    (pIVar48->IO).KeysDown[0x155] = false;
    (pIVar48->IO).KeysDown[0x156] = false;
    (pIVar48->IO).KeysDown[0x157] = false;
    (pIVar48->IO).KeysDown[0x158] = false;
    (pIVar48->IO).KeysDown[0x159] = false;
    (pIVar48->IO).KeysDown[0x15a] = false;
    (pIVar48->IO).KeysDown[0x15b] = false;
    (pIVar48->IO).KeysDown[0x15c] = false;
    (pIVar48->IO).KeysDown[0x15d] = false;
    (pIVar48->IO).KeysDown[0x15e] = false;
    (pIVar48->IO).KeysDown[0x15f] = false;
    (pIVar48->IO).KeysDown[0x160] = false;
    (pIVar48->IO).KeysDown[0x161] = false;
    (pIVar48->IO).KeysDown[0x162] = false;
    (pIVar48->IO).KeysDown[0x163] = false;
    (pIVar48->IO).KeysDown[0x164] = false;
    (pIVar48->IO).KeysDown[0x165] = false;
    (pIVar48->IO).KeysDown[0x166] = false;
    (pIVar48->IO).KeysDown[0x167] = false;
    (pIVar48->IO).KeysDown[0x168] = false;
    (pIVar48->IO).KeysDown[0x169] = false;
    (pIVar48->IO).KeysDown[0x16a] = false;
    (pIVar48->IO).KeysDown[0x16b] = false;
    (pIVar48->IO).KeysDown[0x16c] = false;
    (pIVar48->IO).KeysDown[0x16d] = false;
    (pIVar48->IO).KeysDown[0x16e] = false;
    (pIVar48->IO).KeysDown[0x16f] = false;
    (pIVar48->IO).KeysDown[0x170] = false;
    (pIVar48->IO).KeysDown[0x171] = false;
    (pIVar48->IO).KeysDown[0x172] = false;
    (pIVar48->IO).KeysDown[0x173] = false;
    (pIVar48->IO).KeysDown[0x174] = false;
    (pIVar48->IO).KeysDown[0x175] = false;
    (pIVar48->IO).KeysDown[0x176] = false;
    (pIVar48->IO).KeysDown[0x177] = false;
    (pIVar48->IO).KeysDown[0x178] = false;
    (pIVar48->IO).KeysDown[0x179] = false;
    (pIVar48->IO).KeysDown[0x17a] = false;
    (pIVar48->IO).KeysDown[0x17b] = false;
    (pIVar48->IO).KeysDown[0x17c] = false;
    (pIVar48->IO).KeysDown[0x17d] = false;
    (pIVar48->IO).KeysDown[0x17e] = false;
    (pIVar48->IO).KeysDown[0x17f] = false;
    (pIVar48->IO).KeysDown[0x100] = false;
    (pIVar48->IO).KeysDown[0x101] = false;
    (pIVar48->IO).KeysDown[0x102] = false;
    (pIVar48->IO).KeysDown[0x103] = false;
    (pIVar48->IO).KeysDown[0x104] = false;
    (pIVar48->IO).KeysDown[0x105] = false;
    (pIVar48->IO).KeysDown[0x106] = false;
    (pIVar48->IO).KeysDown[0x107] = false;
    (pIVar48->IO).KeysDown[0x108] = false;
    (pIVar48->IO).KeysDown[0x109] = false;
    (pIVar48->IO).KeysDown[0x10a] = false;
    (pIVar48->IO).KeysDown[0x10b] = false;
    (pIVar48->IO).KeysDown[0x10c] = false;
    (pIVar48->IO).KeysDown[0x10d] = false;
    (pIVar48->IO).KeysDown[0x10e] = false;
    (pIVar48->IO).KeysDown[0x10f] = false;
    (pIVar48->IO).KeysDown[0x110] = false;
    (pIVar48->IO).KeysDown[0x111] = false;
    (pIVar48->IO).KeysDown[0x112] = false;
    (pIVar48->IO).KeysDown[0x113] = false;
    (pIVar48->IO).KeysDown[0x114] = false;
    (pIVar48->IO).KeysDown[0x115] = false;
    (pIVar48->IO).KeysDown[0x116] = false;
    (pIVar48->IO).KeysDown[0x117] = false;
    (pIVar48->IO).KeysDown[0x118] = false;
    (pIVar48->IO).KeysDown[0x119] = false;
    (pIVar48->IO).KeysDown[0x11a] = false;
    (pIVar48->IO).KeysDown[0x11b] = false;
    (pIVar48->IO).KeysDown[0x11c] = false;
    (pIVar48->IO).KeysDown[0x11d] = false;
    (pIVar48->IO).KeysDown[0x11e] = false;
    (pIVar48->IO).KeysDown[0x11f] = false;
    (pIVar48->IO).KeysDown[0x120] = false;
    (pIVar48->IO).KeysDown[0x121] = false;
    (pIVar48->IO).KeysDown[0x122] = false;
    (pIVar48->IO).KeysDown[0x123] = false;
    (pIVar48->IO).KeysDown[0x124] = false;
    (pIVar48->IO).KeysDown[0x125] = false;
    (pIVar48->IO).KeysDown[0x126] = false;
    (pIVar48->IO).KeysDown[0x127] = false;
    (pIVar48->IO).KeysDown[0x128] = false;
    (pIVar48->IO).KeysDown[0x129] = false;
    (pIVar48->IO).KeysDown[0x12a] = false;
    (pIVar48->IO).KeysDown[299] = false;
    (pIVar48->IO).KeysDown[300] = false;
    (pIVar48->IO).KeysDown[0x12d] = false;
    (pIVar48->IO).KeysDown[0x12e] = false;
    (pIVar48->IO).KeysDown[0x12f] = false;
    (pIVar48->IO).KeysDown[0x130] = false;
    (pIVar48->IO).KeysDown[0x131] = false;
    (pIVar48->IO).KeysDown[0x132] = false;
    (pIVar48->IO).KeysDown[0x133] = false;
    (pIVar48->IO).KeysDown[0x134] = false;
    (pIVar48->IO).KeysDown[0x135] = false;
    (pIVar48->IO).KeysDown[0x136] = false;
    (pIVar48->IO).KeysDown[0x137] = false;
    (pIVar48->IO).KeysDown[0x138] = false;
    (pIVar48->IO).KeysDown[0x139] = false;
    (pIVar48->IO).KeysDown[0x13a] = false;
    (pIVar48->IO).KeysDown[0x13b] = false;
    (pIVar48->IO).KeysDown[0x13c] = false;
    (pIVar48->IO).KeysDown[0x13d] = false;
    (pIVar48->IO).KeysDown[0x13e] = false;
    (pIVar48->IO).KeysDown[0x13f] = false;
    (pIVar48->IO).KeysDown[0xc0] = false;
    (pIVar48->IO).KeysDown[0xc1] = false;
    (pIVar48->IO).KeysDown[0xc2] = false;
    (pIVar48->IO).KeysDown[0xc3] = false;
    (pIVar48->IO).KeysDown[0xc4] = false;
    (pIVar48->IO).KeysDown[0xc5] = false;
    (pIVar48->IO).KeysDown[0xc6] = false;
    (pIVar48->IO).KeysDown[199] = false;
    (pIVar48->IO).KeysDown[200] = false;
    (pIVar48->IO).KeysDown[0xc9] = false;
    (pIVar48->IO).KeysDown[0xca] = false;
    (pIVar48->IO).KeysDown[0xcb] = false;
    (pIVar48->IO).KeysDown[0xcc] = false;
    (pIVar48->IO).KeysDown[0xcd] = false;
    (pIVar48->IO).KeysDown[0xce] = false;
    (pIVar48->IO).KeysDown[0xcf] = false;
    (pIVar48->IO).KeysDown[0xd0] = false;
    (pIVar48->IO).KeysDown[0xd1] = false;
    (pIVar48->IO).KeysDown[0xd2] = false;
    (pIVar48->IO).KeysDown[0xd3] = false;
    (pIVar48->IO).KeysDown[0xd4] = false;
    (pIVar48->IO).KeysDown[0xd5] = false;
    (pIVar48->IO).KeysDown[0xd6] = false;
    (pIVar48->IO).KeysDown[0xd7] = false;
    (pIVar48->IO).KeysDown[0xd8] = false;
    (pIVar48->IO).KeysDown[0xd9] = false;
    (pIVar48->IO).KeysDown[0xda] = false;
    (pIVar48->IO).KeysDown[0xdb] = false;
    (pIVar48->IO).KeysDown[0xdc] = false;
    (pIVar48->IO).KeysDown[0xdd] = false;
    (pIVar48->IO).KeysDown[0xde] = false;
    (pIVar48->IO).KeysDown[0xdf] = false;
    (pIVar48->IO).KeysDown[0xe0] = false;
    (pIVar48->IO).KeysDown[0xe1] = false;
    (pIVar48->IO).KeysDown[0xe2] = false;
    (pIVar48->IO).KeysDown[0xe3] = false;
    (pIVar48->IO).KeysDown[0xe4] = false;
    (pIVar48->IO).KeysDown[0xe5] = false;
    (pIVar48->IO).KeysDown[0xe6] = false;
    (pIVar48->IO).KeysDown[0xe7] = false;
    (pIVar48->IO).KeysDown[0xe8] = false;
    (pIVar48->IO).KeysDown[0xe9] = false;
    (pIVar48->IO).KeysDown[0xea] = false;
    (pIVar48->IO).KeysDown[0xeb] = false;
    (pIVar48->IO).KeysDown[0xec] = false;
    (pIVar48->IO).KeysDown[0xed] = false;
    (pIVar48->IO).KeysDown[0xee] = false;
    (pIVar48->IO).KeysDown[0xef] = false;
    (pIVar48->IO).KeysDown[0xf0] = false;
    (pIVar48->IO).KeysDown[0xf1] = false;
    (pIVar48->IO).KeysDown[0xf2] = false;
    (pIVar48->IO).KeysDown[0xf3] = false;
    (pIVar48->IO).KeysDown[0xf4] = false;
    (pIVar48->IO).KeysDown[0xf5] = false;
    (pIVar48->IO).KeysDown[0xf6] = false;
    (pIVar48->IO).KeysDown[0xf7] = false;
    (pIVar48->IO).KeysDown[0xf8] = false;
    (pIVar48->IO).KeysDown[0xf9] = false;
    (pIVar48->IO).KeysDown[0xfa] = false;
    (pIVar48->IO).KeysDown[0xfb] = false;
    (pIVar48->IO).KeysDown[0xfc] = false;
    (pIVar48->IO).KeysDown[0xfd] = false;
    (pIVar48->IO).KeysDown[0xfe] = false;
    (pIVar48->IO).KeysDown[0xff] = false;
    (pIVar48->IO).KeysDown[0x80] = false;
    (pIVar48->IO).KeysDown[0x81] = false;
    (pIVar48->IO).KeysDown[0x82] = false;
    (pIVar48->IO).KeysDown[0x83] = false;
    (pIVar48->IO).KeysDown[0x84] = false;
    (pIVar48->IO).KeysDown[0x85] = false;
    (pIVar48->IO).KeysDown[0x86] = false;
    (pIVar48->IO).KeysDown[0x87] = false;
    (pIVar48->IO).KeysDown[0x88] = false;
    (pIVar48->IO).KeysDown[0x89] = false;
    (pIVar48->IO).KeysDown[0x8a] = false;
    (pIVar48->IO).KeysDown[0x8b] = false;
    (pIVar48->IO).KeysDown[0x8c] = false;
    (pIVar48->IO).KeysDown[0x8d] = false;
    (pIVar48->IO).KeysDown[0x8e] = false;
    (pIVar48->IO).KeysDown[0x8f] = false;
    (pIVar48->IO).KeysDown[0x90] = false;
    (pIVar48->IO).KeysDown[0x91] = false;
    (pIVar48->IO).KeysDown[0x92] = false;
    (pIVar48->IO).KeysDown[0x93] = false;
    (pIVar48->IO).KeysDown[0x94] = false;
    (pIVar48->IO).KeysDown[0x95] = false;
    (pIVar48->IO).KeysDown[0x96] = false;
    (pIVar48->IO).KeysDown[0x97] = false;
    (pIVar48->IO).KeysDown[0x98] = false;
    (pIVar48->IO).KeysDown[0x99] = false;
    (pIVar48->IO).KeysDown[0x9a] = false;
    (pIVar48->IO).KeysDown[0x9b] = false;
    (pIVar48->IO).KeysDown[0x9c] = false;
    (pIVar48->IO).KeysDown[0x9d] = false;
    (pIVar48->IO).KeysDown[0x9e] = false;
    (pIVar48->IO).KeysDown[0x9f] = false;
    (pIVar48->IO).KeysDown[0xa0] = false;
    (pIVar48->IO).KeysDown[0xa1] = false;
    (pIVar48->IO).KeysDown[0xa2] = false;
    (pIVar48->IO).KeysDown[0xa3] = false;
    (pIVar48->IO).KeysDown[0xa4] = false;
    (pIVar48->IO).KeysDown[0xa5] = false;
    (pIVar48->IO).KeysDown[0xa6] = false;
    (pIVar48->IO).KeysDown[0xa7] = false;
    (pIVar48->IO).KeysDown[0xa8] = false;
    (pIVar48->IO).KeysDown[0xa9] = false;
    (pIVar48->IO).KeysDown[0xaa] = false;
    (pIVar48->IO).KeysDown[0xab] = false;
    (pIVar48->IO).KeysDown[0xac] = false;
    (pIVar48->IO).KeysDown[0xad] = false;
    (pIVar48->IO).KeysDown[0xae] = false;
    (pIVar48->IO).KeysDown[0xaf] = false;
    (pIVar48->IO).KeysDown[0xb0] = false;
    (pIVar48->IO).KeysDown[0xb1] = false;
    (pIVar48->IO).KeysDown[0xb2] = false;
    (pIVar48->IO).KeysDown[0xb3] = false;
    (pIVar48->IO).KeysDown[0xb4] = false;
    (pIVar48->IO).KeysDown[0xb5] = false;
    (pIVar48->IO).KeysDown[0xb6] = false;
    (pIVar48->IO).KeysDown[0xb7] = false;
    (pIVar48->IO).KeysDown[0xb8] = false;
    (pIVar48->IO).KeysDown[0xb9] = false;
    (pIVar48->IO).KeysDown[0xba] = false;
    (pIVar48->IO).KeysDown[0xbb] = false;
    (pIVar48->IO).KeysDown[0xbc] = false;
    (pIVar48->IO).KeysDown[0xbd] = false;
    (pIVar48->IO).KeysDown[0xbe] = false;
    (pIVar48->IO).KeysDown[0xbf] = false;
    (pIVar48->IO).KeysDown[0x40] = false;
    (pIVar48->IO).KeysDown[0x41] = false;
    (pIVar48->IO).KeysDown[0x42] = false;
    (pIVar48->IO).KeysDown[0x43] = false;
    (pIVar48->IO).KeysDown[0x44] = false;
    (pIVar48->IO).KeysDown[0x45] = false;
    (pIVar48->IO).KeysDown[0x46] = false;
    (pIVar48->IO).KeysDown[0x47] = false;
    (pIVar48->IO).KeysDown[0x48] = false;
    (pIVar48->IO).KeysDown[0x49] = false;
    (pIVar48->IO).KeysDown[0x4a] = false;
    (pIVar48->IO).KeysDown[0x4b] = false;
    (pIVar48->IO).KeysDown[0x4c] = false;
    (pIVar48->IO).KeysDown[0x4d] = false;
    (pIVar48->IO).KeysDown[0x4e] = false;
    (pIVar48->IO).KeysDown[0x4f] = false;
    (pIVar48->IO).KeysDown[0x50] = false;
    (pIVar48->IO).KeysDown[0x51] = false;
    (pIVar48->IO).KeysDown[0x52] = false;
    (pIVar48->IO).KeysDown[0x53] = false;
    (pIVar48->IO).KeysDown[0x54] = false;
    (pIVar48->IO).KeysDown[0x55] = false;
    (pIVar48->IO).KeysDown[0x56] = false;
    (pIVar48->IO).KeysDown[0x57] = false;
    (pIVar48->IO).KeysDown[0x58] = false;
    (pIVar48->IO).KeysDown[0x59] = false;
    (pIVar48->IO).KeysDown[0x5a] = false;
    (pIVar48->IO).KeysDown[0x5b] = false;
    (pIVar48->IO).KeysDown[0x5c] = false;
    (pIVar48->IO).KeysDown[0x5d] = false;
    (pIVar48->IO).KeysDown[0x5e] = false;
    (pIVar48->IO).KeysDown[0x5f] = false;
    (pIVar48->IO).KeysDown[0x60] = false;
    (pIVar48->IO).KeysDown[0x61] = false;
    (pIVar48->IO).KeysDown[0x62] = false;
    (pIVar48->IO).KeysDown[99] = false;
    (pIVar48->IO).KeysDown[100] = false;
    (pIVar48->IO).KeysDown[0x65] = false;
    (pIVar48->IO).KeysDown[0x66] = false;
    (pIVar48->IO).KeysDown[0x67] = false;
    (pIVar48->IO).KeysDown[0x68] = false;
    (pIVar48->IO).KeysDown[0x69] = false;
    (pIVar48->IO).KeysDown[0x6a] = false;
    (pIVar48->IO).KeysDown[0x6b] = false;
    (pIVar48->IO).KeysDown[0x6c] = false;
    (pIVar48->IO).KeysDown[0x6d] = false;
    (pIVar48->IO).KeysDown[0x6e] = false;
    (pIVar48->IO).KeysDown[0x6f] = false;
    (pIVar48->IO).KeysDown[0x70] = false;
    (pIVar48->IO).KeysDown[0x71] = false;
    (pIVar48->IO).KeysDown[0x72] = false;
    (pIVar48->IO).KeysDown[0x73] = false;
    (pIVar48->IO).KeysDown[0x74] = false;
    (pIVar48->IO).KeysDown[0x75] = false;
    (pIVar48->IO).KeysDown[0x76] = false;
    (pIVar48->IO).KeysDown[0x77] = false;
    (pIVar48->IO).KeysDown[0x78] = false;
    (pIVar48->IO).KeysDown[0x79] = false;
    (pIVar48->IO).KeysDown[0x7a] = false;
    (pIVar48->IO).KeysDown[0x7b] = false;
    (pIVar48->IO).KeysDown[0x7c] = false;
    (pIVar48->IO).KeysDown[0x7d] = false;
    (pIVar48->IO).KeysDown[0x7e] = false;
    (pIVar48->IO).KeysDown[0x7f] = false;
    (pIVar48->IO).KeysDown[0] = false;
    (pIVar48->IO).KeysDown[1] = false;
    (pIVar48->IO).KeysDown[2] = false;
    (pIVar48->IO).KeysDown[3] = false;
    (pIVar48->IO).KeysDown[4] = false;
    (pIVar48->IO).KeysDown[5] = false;
    (pIVar48->IO).KeysDown[6] = false;
    (pIVar48->IO).KeysDown[7] = false;
    (pIVar48->IO).KeysDown[8] = false;
    (pIVar48->IO).KeysDown[9] = false;
    (pIVar48->IO).KeysDown[10] = false;
    (pIVar48->IO).KeysDown[0xb] = false;
    (pIVar48->IO).KeysDown[0xc] = false;
    (pIVar48->IO).KeysDown[0xd] = false;
    (pIVar48->IO).KeysDown[0xe] = false;
    (pIVar48->IO).KeysDown[0xf] = false;
    (pIVar48->IO).KeysDown[0x10] = false;
    (pIVar48->IO).KeysDown[0x11] = false;
    (pIVar48->IO).KeysDown[0x12] = false;
    (pIVar48->IO).KeysDown[0x13] = false;
    (pIVar48->IO).KeysDown[0x14] = false;
    (pIVar48->IO).KeysDown[0x15] = false;
    (pIVar48->IO).KeysDown[0x16] = false;
    (pIVar48->IO).KeysDown[0x17] = false;
    (pIVar48->IO).KeysDown[0x18] = false;
    (pIVar48->IO).KeysDown[0x19] = false;
    (pIVar48->IO).KeysDown[0x1a] = false;
    (pIVar48->IO).KeysDown[0x1b] = false;
    (pIVar48->IO).KeysDown[0x1c] = false;
    (pIVar48->IO).KeysDown[0x1d] = false;
    (pIVar48->IO).KeysDown[0x1e] = false;
    (pIVar48->IO).KeysDown[0x1f] = false;
    (pIVar48->IO).KeysDown[0x20] = false;
    (pIVar48->IO).KeysDown[0x21] = false;
    (pIVar48->IO).KeysDown[0x22] = false;
    (pIVar48->IO).KeysDown[0x23] = false;
    (pIVar48->IO).KeysDown[0x24] = false;
    (pIVar48->IO).KeysDown[0x25] = false;
    (pIVar48->IO).KeysDown[0x26] = false;
    (pIVar48->IO).KeysDown[0x27] = false;
    (pIVar48->IO).KeysDown[0x28] = false;
    (pIVar48->IO).KeysDown[0x29] = false;
    (pIVar48->IO).KeysDown[0x2a] = false;
    (pIVar48->IO).KeysDown[0x2b] = false;
    (pIVar48->IO).KeysDown[0x2c] = false;
    (pIVar48->IO).KeysDown[0x2d] = false;
    (pIVar48->IO).KeysDown[0x2e] = false;
    (pIVar48->IO).KeysDown[0x2f] = false;
    (pIVar48->IO).KeysDown[0x30] = false;
    (pIVar48->IO).KeysDown[0x31] = false;
    (pIVar48->IO).KeysDown[0x32] = false;
    (pIVar48->IO).KeysDown[0x33] = false;
    (pIVar48->IO).KeysDown[0x34] = false;
    (pIVar48->IO).KeysDown[0x35] = false;
    (pIVar48->IO).KeysDown[0x36] = false;
    (pIVar48->IO).KeysDown[0x37] = false;
    (pIVar48->IO).KeysDown[0x38] = false;
    (pIVar48->IO).KeysDown[0x39] = false;
    (pIVar48->IO).KeysDown[0x3a] = false;
    (pIVar48->IO).KeysDown[0x3b] = false;
    (pIVar48->IO).KeysDown[0x3c] = false;
    (pIVar48->IO).KeysDown[0x3d] = false;
    (pIVar48->IO).KeysDown[0x3e] = false;
    (pIVar48->IO).KeysDown[0x3f] = false;
    lVar66 = -0x200;
    auVar80 = vbroadcastss_avx512f(ZEXT416(0xbf800000));
    do {
      *(undefined1 (*) [64])((pIVar48->IO).NavInputsDownDuration + lVar66) = auVar80;
      *(undefined1 (*) [64])((pIVar48->IO).KeysDownDurationPrev + lVar66) = auVar80;
      lVar66 = lVar66 + 0x10;
    } while (lVar66 != 0);
    (pIVar48->IO).KeyMods = 0;
    (pIVar48->IO).KeyModsPrev = 0;
    (pIVar48->IO).KeyCtrl = false;
    (pIVar48->IO).KeyShift = false;
    (pIVar48->IO).KeyAlt = false;
    (pIVar48->IO).KeySuper = false;
    lVar66 = 0;
    auVar81 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar82 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar83 = vpbroadcastq_avx512f(ZEXT816(0x14));
    do {
      auVar84 = vpbroadcastq_avx512f();
      auVar85 = vporq_avx512f(auVar84,auVar81);
      auVar84 = vporq_avx512f(auVar84,auVar82);
      uVar40 = vpcmpuq_avx512f(auVar84,auVar83,1);
      bVar61 = (byte)uVar40;
      uVar40 = vpcmpuq_avx512f(auVar85,auVar83,1);
      bVar70 = (byte)uVar40;
      uVar72 = CONCAT11(bVar70,bVar61);
      pfVar6 = (pIVar48->IO).NavInputsDownDurationPrev + lVar66;
      bVar68 = (bool)((byte)(uVar72 >> 1) & 1);
      bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
      bVar52 = (bool)((byte)(uVar72 >> 3) & 1);
      bVar53 = (bool)((byte)(uVar72 >> 4) & 1);
      bVar54 = (bool)((byte)(uVar72 >> 5) & 1);
      bVar28 = (bool)((byte)(uVar72 >> 6) & 1);
      bVar29 = (bool)((byte)(uVar72 >> 7) & 1);
      bVar30 = (bool)(bVar70 >> 1 & 1);
      bVar31 = (bool)(bVar70 >> 2 & 1);
      bVar32 = (bool)(bVar70 >> 3 & 1);
      bVar33 = (bool)(bVar70 >> 4 & 1);
      bVar34 = (bool)(bVar70 >> 5 & 1);
      bVar35 = (bool)(bVar70 >> 6 & 1);
      *pfVar6 = (float)((uint)(bVar61 & 1) * auVar80._0_4_ |
                       (uint)!(bool)(bVar61 & 1) * (int)*pfVar6);
      pfVar6[1] = (float)((uint)bVar68 * auVar80._4_4_ | (uint)!bVar68 * (int)pfVar6[1]);
      pfVar6[2] = (float)((uint)bVar69 * auVar80._8_4_ | (uint)!bVar69 * (int)pfVar6[2]);
      pfVar6[3] = (float)((uint)bVar52 * auVar80._12_4_ | (uint)!bVar52 * (int)pfVar6[3]);
      pfVar6[4] = (float)((uint)bVar53 * auVar80._16_4_ | (uint)!bVar53 * (int)pfVar6[4]);
      pfVar6[5] = (float)((uint)bVar54 * auVar80._20_4_ | (uint)!bVar54 * (int)pfVar6[5]);
      pfVar6[6] = (float)((uint)bVar28 * auVar80._24_4_ | (uint)!bVar28 * (int)pfVar6[6]);
      pfVar6[7] = (float)((uint)bVar29 * auVar80._28_4_ | (uint)!bVar29 * (int)pfVar6[7]);
      pfVar6[8] = (float)((uint)(bVar70 & 1) * auVar80._32_4_ |
                         (uint)!(bool)(bVar70 & 1) * (int)pfVar6[8]);
      pfVar6[9] = (float)((uint)bVar30 * auVar80._36_4_ | (uint)!bVar30 * (int)pfVar6[9]);
      pfVar6[10] = (float)((uint)bVar31 * auVar80._40_4_ | (uint)!bVar31 * (int)pfVar6[10]);
      pfVar6[0xb] = (float)((uint)bVar32 * auVar80._44_4_ | (uint)!bVar32 * (int)pfVar6[0xb]);
      pfVar6[0xc] = (float)((uint)bVar33 * auVar80._48_4_ | (uint)!bVar33 * (int)pfVar6[0xc]);
      pfVar6[0xd] = (float)((uint)bVar34 * auVar80._52_4_ | (uint)!bVar34 * (int)pfVar6[0xd]);
      pfVar6[0xe] = (float)((uint)bVar35 * auVar80._56_4_ | (uint)!bVar35 * (int)pfVar6[0xe]);
      pfVar6[0xf] = (float)((uint)(bVar70 >> 7) * auVar80._60_4_ |
                           (uint)!(bool)(bVar70 >> 7) * (int)pfVar6[0xf]);
      pfVar6 = (pIVar48->IO).NavInputsDownDuration + lVar66;
      bVar68 = (bool)((byte)(uVar72 >> 1) & 1);
      bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
      bVar52 = (bool)((byte)(uVar72 >> 3) & 1);
      bVar53 = (bool)((byte)(uVar72 >> 4) & 1);
      bVar54 = (bool)((byte)(uVar72 >> 5) & 1);
      bVar28 = (bool)((byte)(uVar72 >> 6) & 1);
      bVar29 = (bool)((byte)(uVar72 >> 7) & 1);
      bVar30 = (bool)(bVar70 >> 1 & 1);
      bVar31 = (bool)(bVar70 >> 2 & 1);
      bVar32 = (bool)(bVar70 >> 3 & 1);
      bVar33 = (bool)(bVar70 >> 4 & 1);
      bVar34 = (bool)(bVar70 >> 5 & 1);
      bVar35 = (bool)(bVar70 >> 6 & 1);
      *pfVar6 = (float)((uint)(bVar61 & 1) * auVar80._0_4_ |
                       (uint)!(bool)(bVar61 & 1) * (int)*pfVar6);
      pfVar6[1] = (float)((uint)bVar68 * auVar80._4_4_ | (uint)!bVar68 * (int)pfVar6[1]);
      pfVar6[2] = (float)((uint)bVar69 * auVar80._8_4_ | (uint)!bVar69 * (int)pfVar6[2]);
      pfVar6[3] = (float)((uint)bVar52 * auVar80._12_4_ | (uint)!bVar52 * (int)pfVar6[3]);
      pfVar6[4] = (float)((uint)bVar53 * auVar80._16_4_ | (uint)!bVar53 * (int)pfVar6[4]);
      pfVar6[5] = (float)((uint)bVar54 * auVar80._20_4_ | (uint)!bVar54 * (int)pfVar6[5]);
      pfVar6[6] = (float)((uint)bVar28 * auVar80._24_4_ | (uint)!bVar28 * (int)pfVar6[6]);
      pfVar6[7] = (float)((uint)bVar29 * auVar80._28_4_ | (uint)!bVar29 * (int)pfVar6[7]);
      pfVar6[8] = (float)((uint)(bVar70 & 1) * auVar80._32_4_ |
                         (uint)!(bool)(bVar70 & 1) * (int)pfVar6[8]);
      pfVar6[9] = (float)((uint)bVar30 * auVar80._36_4_ | (uint)!bVar30 * (int)pfVar6[9]);
      pfVar6[10] = (float)((uint)bVar31 * auVar80._40_4_ | (uint)!bVar31 * (int)pfVar6[10]);
      pfVar6[0xb] = (float)((uint)bVar32 * auVar80._44_4_ | (uint)!bVar32 * (int)pfVar6[0xb]);
      pfVar6[0xc] = (float)((uint)bVar33 * auVar80._48_4_ | (uint)!bVar33 * (int)pfVar6[0xc]);
      pfVar6[0xd] = (float)((uint)bVar34 * auVar80._52_4_ | (uint)!bVar34 * (int)pfVar6[0xd]);
      pfVar6[0xe] = (float)((uint)bVar35 * auVar80._56_4_ | (uint)!bVar35 * (int)pfVar6[0xe]);
      pfVar6[0xf] = (float)((uint)(bVar70 >> 7) * auVar80._60_4_ |
                           (uint)!(bool)(bVar70 >> 7) * (int)pfVar6[0xf]);
      lVar66 = lVar66 + 0x10;
    } while (lVar66 != 0x20);
    (pIVar48->IO).AppFocusLost = false;
  }
  pIVar49 = GImGui;
  bVar68 = (GImGui->IO).KeyCtrl;
  uVar58 = bVar68 + 2;
  if ((GImGui->IO).KeyShift == false) {
    uVar58 = (uint)bVar68;
  }
  uVar55 = uVar58 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar55 = uVar58;
  }
  uVar58 = uVar55 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar58 = uVar55;
  }
  (pIVar48->IO).KeyMods = uVar58;
  memcpy((pIVar48->IO).KeysDownDurationPrev,(pIVar48->IO).KeysDownDuration,0x800);
  lVar66 = 0x144;
  do {
    fVar93 = -1.0;
    if (*(char *)((long)(pIVar48->IO).KeyMap + lVar66 + -0x3c) == '\x01') {
      fVar94 = *(float *)((long)pIVar48 + lVar66 * 4 + -0x5c);
      fVar93 = 0.0;
      if (0.0 <= fVar94) {
        fVar93 = fVar94 + (pIVar48->IO).DeltaTime;
      }
    }
    *(float *)((long)pIVar48 + lVar66 * 4 + -0x5c) = fVar93;
    lVar66 = lVar66 + 1;
  } while (lVar66 != 0x344);
  (pIVar49->IO).WantSetMousePos = false;
  uVar58 = (pIVar49->IO).ConfigFlags;
  if ((uVar58 & 2) == 0) {
    bVar61 = 0;
  }
  else {
    bVar61 = (byte)(pIVar49->IO).BackendFlags & 1;
  }
  if (((bVar61 != 0) && (pIVar49->NavInputSource != ImGuiInputSource_Gamepad)) &&
     ((((0.0 < (pIVar49->IO).NavInputs[0] ||
        ((0.0 < (pIVar49->IO).NavInputs[2] || (0.0 < (pIVar49->IO).NavInputs[1])))) ||
       (0.0 < (pIVar49->IO).NavInputs[3])) ||
      ((((0.0 < (pIVar49->IO).NavInputs[4] || (0.0 < (pIVar49->IO).NavInputs[5])) ||
        (0.0 < (pIVar49->IO).NavInputs[6])) || (0.0 < (pIVar49->IO).NavInputs[7])))))) {
    pIVar49->NavInputSource = ImGuiInputSource_Gamepad;
  }
  if ((uVar58 & 1) != 0) {
    lVar66 = (long)(pIVar49->IO).KeyMap[0xc];
    if ((-1 < lVar66) && ((pIVar49->IO).KeysDown[lVar66] == true)) {
      (pIVar49->IO).NavInputs[0] = 1.0;
      pIVar49->NavInputSource = ImGuiInputSource_Keyboard;
    }
    lVar66 = (long)(pIVar49->IO).KeyMap[0xd];
    if ((-1 < lVar66) && ((pIVar49->IO).KeysDown[lVar66] == true)) {
      (pIVar49->IO).NavInputs[2] = 1.0;
      pIVar49->NavInputSource = ImGuiInputSource_Keyboard;
    }
    lVar66 = (long)(pIVar49->IO).KeyMap[0xe];
    if ((-1 < lVar66) && ((pIVar49->IO).KeysDown[lVar66] == true)) {
      (pIVar49->IO).NavInputs[1] = 1.0;
      pIVar49->NavInputSource = ImGuiInputSource_Keyboard;
    }
    lVar66 = (long)(pIVar49->IO).KeyMap[1];
    if ((-1 < lVar66) && ((pIVar49->IO).KeysDown[lVar66] == true)) {
      (pIVar49->IO).NavInputs[0x10] = 1.0;
      pIVar49->NavInputSource = ImGuiInputSource_Keyboard;
    }
    lVar66 = (long)(pIVar49->IO).KeyMap[2];
    if ((-1 < lVar66) && ((pIVar49->IO).KeysDown[lVar66] == true)) {
      (pIVar49->IO).NavInputs[0x11] = 1.0;
      pIVar49->NavInputSource = ImGuiInputSource_Keyboard;
    }
    lVar66 = (long)(pIVar49->IO).KeyMap[3];
    if ((-1 < lVar66) && ((pIVar49->IO).KeysDown[lVar66] == true)) {
      (pIVar49->IO).NavInputs[0x12] = 1.0;
      pIVar49->NavInputSource = ImGuiInputSource_Keyboard;
    }
    lVar66 = (long)(pIVar49->IO).KeyMap[4];
    if ((-1 < lVar66) && ((pIVar49->IO).KeysDown[lVar66] == true)) {
      (pIVar49->IO).NavInputs[0x13] = 1.0;
      pIVar49->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar49->IO).KeyCtrl == true) {
      (pIVar49->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar49->IO).KeyShift == true) {
      (pIVar49->IO).NavInputs[0xf] = 1.0;
    }
  }
  auVar80 = *(undefined1 (*) [64])(pIVar49->IO).NavInputsDownDuration;
  uVar40 = *(undefined8 *)((pIVar49->IO).NavInputsDownDuration + 6);
  uVar37 = *(undefined8 *)((pIVar49->IO).NavInputsDownDuration + 8);
  uVar38 = *(undefined8 *)((pIVar49->IO).NavInputsDownDuration + 10);
  uVar39 = *(undefined8 *)((pIVar49->IO).NavInputsDownDuration + 0xc);
  uVar45 = *(undefined8 *)((pIVar49->IO).NavInputsDownDuration + 0xe);
  uVar46 = *(undefined8 *)((pIVar49->IO).NavInputsDownDuration + 0x10);
  uVar47 = *(undefined8 *)((pIVar49->IO).NavInputsDownDuration + 0x12);
  *(undefined8 *)((pIVar49->IO).NavInputsDownDurationPrev + 4) =
       *(undefined8 *)((pIVar49->IO).NavInputsDownDuration + 4);
  *(undefined8 *)((pIVar49->IO).NavInputsDownDurationPrev + 6) = uVar40;
  *(undefined8 *)((pIVar49->IO).NavInputsDownDurationPrev + 8) = uVar37;
  *(undefined8 *)((pIVar49->IO).NavInputsDownDurationPrev + 10) = uVar38;
  *(undefined8 *)((pIVar49->IO).NavInputsDownDurationPrev + 0xc) = uVar39;
  *(undefined8 *)((pIVar49->IO).NavInputsDownDurationPrev + 0xe) = uVar45;
  *(undefined8 *)((pIVar49->IO).NavInputsDownDurationPrev + 0x10) = uVar46;
  *(undefined8 *)((pIVar49->IO).NavInputsDownDurationPrev + 0x12) = uVar47;
  *(undefined1 (*) [64])(pIVar49->IO).NavInputsDownDurationPrev = auVar80;
  lVar66 = 0;
  do {
    fVar93 = -1.0;
    if (0.0 < (pIVar49->IO).NavInputs[lVar66]) {
      fVar94 = (pIVar49->IO).NavInputsDownDuration[lVar66];
      fVar93 = 0.0;
      if (0.0 <= fVar94) {
        fVar93 = fVar94 + (pIVar49->IO).DeltaTime;
      }
    }
    (pIVar49->IO).NavInputsDownDuration[lVar66] = fVar93;
    lVar66 = lVar66 + 1;
  } while (lVar66 != 0x14);
  if (pIVar49->NavInitResultId != 0) {
    NavInitRequestApplyResult();
  }
  pIVar49->NavInitRequest = false;
  pIVar49->NavInitRequestFromMove = false;
  pIVar49->NavInitResultId = 0;
  pIVar49->NavJustMovedToId = 0;
  if (pIVar49->NavMoveSubmitted == true) {
    NavMoveRequestApplyResult();
  }
  pIVar49->NavTabbingCounter = 0;
  pIVar49->NavMoveSubmitted = false;
  pIVar49->NavMoveScoringItems = false;
  if ((((pIVar49->NavMousePosDirty == true) && (pIVar49->NavIdIsAlive == true)) &&
      (pIVar49->NavDisableHighlight == false)) && (pIVar49->NavDisableMouseHover == true)) {
    bVar68 = pIVar49->NavWindow != (ImGuiWindow *)0x0;
  }
  else {
    bVar68 = false;
  }
  pIVar49->NavMousePosDirty = false;
  pIVar56 = pIVar49->NavWindow;
  pIVar60 = pIVar56;
  if (pIVar56 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar60->RootWindow == pIVar60) || ((pIVar60->Flags & 0x14000000) != 0)) {
        if (pIVar60 != pIVar56) {
          pIVar60->NavLastChildNavWindow = pIVar56;
        }
        break;
      }
      ppIVar2 = &pIVar60->ParentWindow;
      pIVar60 = *ppIVar2;
    } while (*ppIVar2 != (ImGuiWindow *)0x0);
    if (((pIVar56 != (ImGuiWindow *)0x0) && (pIVar56->NavLastChildNavWindow != (ImGuiWindow *)0x0))
       && (pIVar49->NavLayer == ImGuiNavLayer_Main)) {
      pIVar56->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar51 = GImGui;
  pIVar56 = GetTopMostPopupModal();
  if (pIVar56 != (ImGuiWindow *)0x0) {
    pIVar51->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar51->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar51->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1200000),0),ZEXT416((uint)(pIVar51->IO).DeltaTime),
                              ZEXT416((uint)pIVar51->NavWindowingHighlightAlpha));
    auVar96._0_12_ = ZEXT812(0);
    auVar96._12_4_ = 0;
    uVar40 = vcmpss_avx512f(auVar96,auVar76,2);
    auVar81._16_48_ = auVar80._16_48_;
    auVar81._0_16_ = auVar76;
    fVar93 = (float)((uint)((byte)uVar40 & 1) * auVar76._0_4_);
    auVar80._4_60_ = auVar81._4_60_;
    auVar80._0_4_ = fVar93;
    pIVar51->NavWindowingHighlightAlpha = fVar93;
    if ((pIVar51->DimBgRatio <= 0.0) && (fVar93 <= 0.0)) {
      pIVar51->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar56 == (ImGuiWindow *)0x0) && (pIVar51->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    uVar40 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)(pIVar51->IO).NavInputsDownDuration[3])
                            ,0);
    bVar69 = (bool)((byte)uVar40 & 1);
  }
  else {
    bVar69 = false;
  }
  if ((((pIVar56 == (ImGuiWindow *)0x0) && (pIVar51->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
      ((pIVar51->IO).KeyCtrl == true)) && (iVar62 = (pIVar51->IO).KeyMap[0], -1 < iVar62)) {
    bVar52 = IsKeyPressed(iVar62,true);
  }
  else {
    bVar52 = false;
  }
  if ((bVar69 | bVar52) == 1) {
    pIVar56 = pIVar51->NavWindow;
    if (pIVar56 == (ImGuiWindow *)0x0) {
      pIVar56 = FindWindowNavFocusable((pIVar51->WindowsFocusOrder).Size + -1,-0x7fffffff,-1);
    }
    if (pIVar56 != (ImGuiWindow *)0x0) {
      pIVar56 = pIVar56->RootWindow;
      pIVar51->NavWindowingTargetAnim = pIVar56;
      pIVar51->NavWindowingTarget = pIVar56;
      pIVar51->NavWindowingTimer = 0.0;
      pIVar51->NavWindowingHighlightAlpha = 0.0;
      pIVar51->NavWindowingToggleLayer = bVar69;
      pIVar51->NavInputSource = bVar52 ^ ImGuiInputSource_Gamepad;
    }
  }
  fVar93 = (pIVar51->IO).DeltaTime + pIVar51->NavWindowingTimer;
  pIVar51->NavWindowingTimer = fVar93;
  if ((pIVar51->NavWindowingTarget == (ImGuiWindow *)0x0) ||
     (pIVar51->NavInputSource != ImGuiInputSource_Gamepad)) {
LAB_002b7d5d:
    bVar69 = false;
    pIVar56 = (ImGuiWindow *)0x0;
  }
  else {
    auVar97._0_4_ = (fVar93 + -0.2) / 0.05;
    auVar97._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar76 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar97);
    uVar40 = vcmpss_avx512f(auVar97,ZEXT816(0) << 0x40,1);
    auVar83._16_48_ = auVar80._16_48_;
    auVar83._0_16_ = auVar76;
    iVar62 = (uint)!(bool)((byte)uVar40 & 1) * auVar76._0_4_;
    auVar82._4_60_ = auVar83._4_60_;
    auVar82._0_4_ = iVar62;
    auVar84._0_16_ = auVar82._0_16_;
    uVar40 = vcmpss_avx512f(auVar84._0_16_,ZEXT416((uint)pIVar51->NavWindowingHighlightAlpha),2);
    bVar69 = (bool)((byte)uVar40 & 1);
    auVar84._16_48_ = auVar83._16_48_;
    auVar80._4_60_ = auVar84._4_60_;
    auVar80._0_4_ =
         (float)((uint)bVar69 * (int)pIVar51->NavWindowingHighlightAlpha + (uint)!bVar69 * iVar62);
    pIVar51->NavWindowingHighlightAlpha = auVar80._0_4_;
    fVar93 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
    fVar94 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
    iVar62 = (uint)(0.0 < fVar93) - (uint)(0.0 < fVar94);
    if (iVar62 != 0) {
      NavUpdateWindowingHighlightWindow(iVar62);
      pIVar51->NavWindowingHighlightAlpha = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) goto LAB_002b7d5d;
    pbVar3 = &pIVar51->NavWindowingToggleLayer;
    *pbVar3 = (bool)(*pbVar3 & pIVar51->NavWindowingHighlightAlpha < 1.0);
    if (*pbVar3 == false) {
      pIVar56 = pIVar51->NavWindowingTarget;
      bVar69 = false;
    }
    else {
      bVar69 = pIVar51->NavWindow != (ImGuiWindow *)0x0;
      pIVar56 = (ImGuiWindow *)0x0;
    }
    pIVar51->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar51->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (pIVar51->NavInputSource == ImGuiInputSource_Keyboard)) {
    auVar98._0_4_ = (pIVar51->NavWindowingTimer + -0.2) / 0.05;
    auVar98._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar76 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar98);
    uVar40 = vcmpss_avx512f(auVar98,ZEXT816(0) << 0x40,1);
    auVar86._16_48_ = auVar80._16_48_;
    auVar86._0_16_ = auVar76;
    iVar62 = (uint)!(bool)((byte)uVar40 & 1) * auVar76._0_4_;
    auVar85._4_60_ = auVar86._4_60_;
    auVar85._0_4_ = iVar62;
    auVar87._0_16_ = auVar85._0_16_;
    uVar40 = vcmpss_avx512f(auVar87._0_16_,ZEXT416((uint)pIVar51->NavWindowingHighlightAlpha),2);
    bVar52 = (bool)((byte)uVar40 & 1);
    auVar87._16_48_ = auVar86._16_48_;
    auVar80._4_60_ = auVar87._4_60_;
    auVar80._0_4_ =
         (float)((uint)bVar52 * (int)pIVar51->NavWindowingHighlightAlpha + (uint)!bVar52 * iVar62);
    pIVar51->NavWindowingHighlightAlpha = auVar80._0_4_;
    iVar62 = (GImGui->IO).KeyMap[0];
    if ((-1 < iVar62) && (bVar52 = IsKeyPressed(iVar62,true), bVar52)) {
      NavUpdateWindowingHighlightWindow((pIVar51->IO).KeyShift - 1 | 1);
    }
    if ((pIVar51->IO).KeyCtrl == false) {
      pIVar56 = pIVar51->NavWindowingTarget;
    }
  }
  if (((((pIVar51->IO).ConfigFlags & 1) != 0) && ((pIVar51->IO).KeyMods == 4)) &&
     (((pIVar51->IO).KeyModsPrev & 4) == 0)) {
    pIVar51->NavWindowingToggleLayer = true;
    pIVar51->NavInputSource = ImGuiInputSource_Keyboard;
  }
  if ((pIVar51->NavWindowingToggleLayer == true) &&
     (pIVar51->NavInputSource == ImGuiInputSource_Keyboard)) {
    if (((0 < (pIVar51->IO).InputQueueCharacters.Size) ||
        (((pIVar51->IO).KeyCtrl != false || ((pIVar51->IO).KeyShift != false)))) ||
       ((pIVar51->IO).KeySuper == true)) {
      pIVar51->NavWindowingToggleLayer = false;
    }
    bVar52 = bVar69;
    if ((((((pIVar51->IO).KeyMods & 4) == 0) && (((pIVar51->IO).KeyModsPrev & 4) != 0)) &&
        (pIVar51->NavWindowingToggleLayer == true)) &&
       ((pIVar51->ActiveId == 0 || (pIVar51->ActiveIdAllowOverlap == true)))) {
      auVar76 = SUB6416(ZEXT464(0xc87a0000),0);
      uVar40 = vcmpps_avx512vl(auVar76,ZEXT416((uint)(pIVar51->IO).MousePos.x),2);
      uVar37 = vcmpps_avx512vl(auVar76,ZEXT416((uint)(pIVar51->IO).MousePos.y),2);
      uVar38 = vcmpps_avx512vl(auVar76,ZEXT416((uint)(pIVar51->IO).MousePosPrev.x),2);
      uVar39 = vcmpps_avx512vl(auVar76,ZEXT416((uint)(pIVar51->IO).MousePosPrev.y),2);
      bVar52 = true;
      if ((((byte)uVar38 & (byte)uVar39 ^ (byte)uVar40 & (byte)uVar37) & 1) != 0) {
        bVar52 = bVar69;
      }
    }
    bVar69 = bVar52;
    if ((pIVar51->IO).KeyAlt == false) {
      pIVar51->NavWindowingToggleLayer = false;
    }
  }
  pIVar60 = pIVar51->NavWindowingTarget;
  if ((pIVar60 != (ImGuiWindow *)0x0) && ((pIVar60->Flags & 4) == 0)) {
    auVar76 = ZEXT816(0) << 0x40;
    if ((pIVar51->NavInputSource == ImGuiInputSource_Keyboard) && ((pIVar51->IO).KeyShift == false))
    {
      lVar66 = (long)(GImGui->IO).KeyMap[2];
      fVar93 = 0.0;
      fVar94 = 0.0;
      if (-1 < lVar66) {
        fVar94 = (float)(int)(GImGui->IO).KeysDown[lVar66];
      }
      lVar66 = (long)(GImGui->IO).KeyMap[1];
      if (-1 < lVar66) {
        fVar93 = (float)(int)(GImGui->IO).KeysDown[lVar66];
      }
      lVar66 = (long)(GImGui->IO).KeyMap[4];
      fVar126 = 0.0;
      fVar134 = 0.0;
      if (-1 < lVar66) {
        fVar134 = (float)(int)(GImGui->IO).KeysDown[lVar66];
      }
      lVar66 = (long)(GImGui->IO).KeyMap[3];
      if (-1 < lVar66) {
        fVar126 = (float)(int)(GImGui->IO).KeysDown[lVar66];
      }
      auVar76 = vinsertps_avx(ZEXT416((uint)(fVar94 - fVar93)),ZEXT416((uint)(fVar134 - fVar126)),
                              0x10);
    }
    if (pIVar51->NavInputSource == ImGuiInputSource_Gamepad) {
      auVar115._0_8_ = GetNavInputAmount2d(8,ImGuiInputReadMode_Down,0.0,0.0);
      auVar115._8_56_ = extraout_var;
      auVar76 = auVar115._0_16_;
    }
    if (auVar76._0_4_ == 0.0) {
      auVar74 = vmovshdup_avx(auVar76);
      if ((auVar74._0_4_ == 0.0) && (!NAN(auVar74._0_4_))) goto LAB_002b80b2;
    }
    auVar74 = vminss_avx(ZEXT416((uint)(pIVar51->IO).DisplayFramebufferScale.x),
                         ZEXT416((uint)(pIVar51->IO).DisplayFramebufferScale.y));
    auVar74 = vcvtdq2ps_avx(ZEXT416((uint)(int)((pIVar51->IO).DeltaTime * 800.0 * auVar74._0_4_)));
    pIVar60 = pIVar60->RootWindow;
    fVar93 = auVar74._0_4_;
    auVar99._0_4_ = (pIVar60->Pos).x + auVar76._0_4_ * fVar93;
    auVar99._4_4_ = (pIVar60->Pos).y + auVar76._4_4_ * fVar93;
    auVar99._8_4_ = auVar76._8_4_ * fVar93 + 0.0;
    auVar99._12_4_ = auVar76._12_4_ * fVar93 + 0.0;
    local_38 = (ImVec2)vmovlps_avx(auVar99);
    SetWindowPos(pIVar60,&local_38,1);
    if (((pIVar60->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
      GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
    }
    pIVar51->NavDisableMouseHover = true;
  }
LAB_002b80b2:
  if (pIVar56 != (ImGuiWindow *)0x0) {
    if ((pIVar51->NavWindow == (ImGuiWindow *)0x0) || (pIVar56 != pIVar51->NavWindow->RootWindow)) {
      ClearActiveID();
      pIVar50 = GImGui;
      pIVar50->NavMousePosDirty = true;
      pIVar50->NavDisableHighlight = false;
      pIVar50->NavDisableMouseHover = true;
      pIVar60 = pIVar56->NavLastChildNavWindow;
      if ((pIVar60 == (ImGuiWindow *)0x0) || (pIVar60->WasActive == false)) {
        pIVar60 = pIVar56;
      }
      ClosePopupsOverWindow(pIVar60,false);
      FocusWindow(pIVar60);
      if (pIVar60->NavLastIds[0] == 0) {
        NavInitWindow(pIVar60,false);
      }
      if ((pIVar60->DC).NavLayersActiveMaskNext == 2) {
        pIVar51->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar51->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar69) && (pIVar51->NavWindow != (ImGuiWindow *)0x0)) {
    ClearActiveID();
    pIVar56 = pIVar51->NavWindow;
    pIVar60 = pIVar56;
    do {
      window = pIVar60;
      if ((window->ParentWindow == (ImGuiWindow *)0x0) ||
         (((window->DC).NavLayersActiveMask & 2) != 0)) break;
      pIVar60 = window->ParentWindow;
    } while ((window->Flags & 0x15000000U) == 0x1000000);
    if (window != pIVar56) {
      FocusWindow(window);
      window->NavLastChildNavWindow = pIVar56;
    }
    IVar64 = ImGuiNavLayer_Main;
    if (((pIVar51->NavWindow->DC).NavLayersActiveMask & 2) != 0) {
      IVar64 = pIVar51->NavLayer ^ ImGuiNavLayer_Menu;
    }
    if (IVar64 != pIVar51->NavLayer) {
      if (IVar64 == ImGuiNavLayer_Menu) {
        pIVar51->NavWindow->NavLastIds[1] = 0;
      }
      NavRestoreLayer(IVar64);
      pIVar51 = GImGui;
      pIVar51->NavMousePosDirty = true;
      pIVar51->NavDisableHighlight = false;
      pIVar51->NavDisableMouseHover = true;
    }
  }
  if (((uVar58 & 1) == 0 && bVar61 == 0) || (pIVar49->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar49->IO).NavActive = false;
LAB_002b8267:
    bVar69 = pIVar49->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar69 = (pIVar49->NavWindow->Flags & 0x40000U) == 0;
    (pIVar49->IO).NavActive = bVar69;
    if (((!bVar69) || (pIVar49->NavId == 0)) ||
       (bVar69 = true, pIVar49->NavDisableHighlight != false)) goto LAB_002b8267;
  }
  (pIVar49->IO).NavVisible = bVar69;
  pIVar51 = GImGui;
  fVar93 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar93 == 0.0) && (!NAN(fVar93))) {
    if (GImGui->ActiveId == 0) {
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        pIVar56 = GImGui->NavWindow;
        if (((pIVar56 == (ImGuiWindow *)0x0) || (pIVar56 == pIVar56->RootWindow)) ||
           (((pIVar56->Flags & 0x4000000) != 0 ||
            (pIVar60 = pIVar56->ParentWindow, pIVar60 == (ImGuiWindow *)0x0)))) {
          iVar62 = (GImGui->OpenPopupStack).Size;
          if ((long)iVar62 < 1) {
            if ((pIVar56 != (ImGuiWindow *)0x0) && ((pIVar56->Flags & 0x5000000U) != 0x1000000)) {
              pIVar56->NavLastIds[0] = 0;
            }
            pIVar51->NavId = 0;
            pIVar51->NavFocusScopeId = 0;
          }
          else if ((((GImGui->OpenPopupStack).Data[(long)iVar62 + -1].Window)->Flags & 0x8000000) ==
                   0) {
            ClosePopupToLevel(iVar62 + -1,true);
          }
        }
        else {
          IVar13 = pIVar56->Pos;
          local_58._8_8_ = 0;
          local_58._0_4_ = IVar13.x;
          local_58._4_4_ = IVar13.y;
          local_78._4_4_ = IVar13.y + (pIVar56->Size).y;
          local_78._0_4_ = IVar13.x + (pIVar56->Size).x;
          local_78._8_8_ = 0;
          FocusWindow(pIVar60);
          pIVar51 = GImGui;
          IVar63 = pIVar56->ChildId;
          auVar100._8_8_ = 0;
          auVar100._0_4_ = (pIVar60->DC).CursorStartPos.x;
          auVar100._4_4_ = (pIVar60->DC).CursorStartPos.y;
          auVar76 = vsubps_avx(local_58,auVar100);
          auVar74 = vsubps_avx(local_78,auVar100);
          IVar36 = (ImRect)vmovlhps_avx(auVar76,auVar74);
          GImGui->NavId = IVar63;
          pIVar51->NavLayer = ImGuiNavLayer_Main;
          pIVar51->NavFocusScopeId = 0;
          pIVar56 = pIVar51->NavWindow;
          pIVar56->NavLastIds[0] = IVar63;
          pIVar56->NavRectRel[0] = IVar36;
          pIVar51->NavMousePosDirty = true;
          pIVar51->NavDisableHighlight = false;
          pIVar51->NavDisableMouseHover = true;
        }
      }
      else {
        NavRestoreLayer(ImGuiNavLayer_Main);
        pIVar51 = GImGui;
        pIVar51->NavMousePosDirty = true;
        pIVar51->NavDisableHighlight = false;
        pIVar51->NavDisableMouseHover = true;
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
  pIVar49->NavActivateId = 0;
  pIVar49->NavActivateDownId = 0;
  pIVar49->NavActivatePressedId = 0;
  pIVar49->NavActivateInputId = 0;
  pIVar49->NavActivateFlags = 0;
  IVar63 = pIVar49->NavId;
  if ((((IVar63 != 0) && (pIVar49->NavDisableHighlight == false)) &&
      (pIVar49->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
     ((pIVar49->NavWindow != (ImGuiWindow *)0x0 && ((pIVar49->NavWindow->Flags & 0x40000) == 0)))) {
    fVar93 = (GImGui->IO).NavInputs[0];
    if (0.0 < fVar93) {
      uVar40 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                              ZEXT416((uint)(GImGui->IO).NavInputsDownDuration[0]),0);
      bVar70 = (byte)uVar40 & 1;
    }
    else {
      bVar70 = 0;
    }
    if ((GImGui->IO).NavInputs[2] <= 0.0) {
      bVar71 = 0;
    }
    else {
      auVar121._0_12_ = ZEXT812(0);
      auVar121._12_4_ = 0;
      uVar40 = vcmpss_avx512f(auVar121,ZEXT416((uint)(GImGui->IO).NavInputsDownDuration[2]),0);
      bVar71 = (byte)uVar40 & 1;
    }
    IVar17 = pIVar49->ActiveId;
    if (bVar70 == 1 && IVar17 == 0) {
      pIVar49->NavActivateId = IVar63;
      pIVar49->NavActivateFlags = 2;
    }
    if (IVar17 != 0) {
      bVar71 = bVar71 & IVar17 == IVar63;
    }
    if (bVar71 != 0) {
      pIVar49->NavActivateInputId = IVar63;
      pIVar49->NavActivateFlags = 1;
    }
    if (IVar17 == 0) {
      if (0.0 < fVar93) goto LAB_002b89b9;
    }
    else if (IVar17 == IVar63 && 0.0 < fVar93) {
LAB_002b89b9:
      pIVar49->NavActivateDownId = IVar63;
    }
    if (IVar17 != 0) {
      bVar70 = bVar70 & IVar17 == IVar63;
    }
    if (bVar70 != 0) {
      pIVar49->NavActivatePressedId = IVar63;
    }
  }
  if ((pIVar49->NavWindow != (ImGuiWindow *)0x0) && ((pIVar49->NavWindow->Flags & 0x40000) != 0)) {
    pIVar49->NavDisableHighlight = true;
  }
  IVar63 = pIVar49->NavNextActivateId;
  if (IVar63 != 0) {
    if ((pIVar49->NavNextActivateFlags & 1U) == 0) {
      pIVar49->NavActivatePressedId = IVar63;
      pIVar49->NavActivateDownId = IVar63;
      pIVar49->NavActivateId = IVar63;
    }
    else {
      pIVar49->NavActivateInputId = IVar63;
    }
    pIVar49->NavActivateFlags = pIVar49->NavNextActivateFlags;
  }
  pIVar49->NavNextActivateId = 0;
  pIVar51 = GImGui;
  pIVar56 = GImGui->NavWindow;
  if ((GImGui->NavMoveForwardToNextFrame & pIVar56 != (ImGuiWindow *)0x0) == 0) {
    GImGui->NavMoveDir = -1;
    pIVar51->NavMoveFlags = 0;
    pIVar51->NavMoveScrollFlags = 0;
    if (((pIVar56 != (ImGuiWindow *)0x0) && (pIVar51->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar56->Flags & 0x40000) == 0)) {
      uVar55 = pIVar51->ActiveIdUsingNavDirMask;
      if (((uVar55 & 1) == 0) &&
         ((fVar93 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar93 ||
          (fVar93 = GetNavInputAmount(0x10,ImGuiInputReadMode_Repeat), 0.0 < fVar93)))) {
        pIVar51->NavMoveDir = 0;
      }
      if (((uVar55 & 2) == 0) &&
         ((fVar93 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar93 ||
          (fVar93 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar93)))) {
        pIVar51->NavMoveDir = 1;
      }
      if (((uVar55 & 4) == 0) &&
         ((fVar93 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar93 ||
          (fVar93 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar93)))) {
        pIVar51->NavMoveDir = 2;
      }
      if (((uVar55 & 8) == 0) &&
         ((fVar93 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar93 ||
          (fVar93 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar93)))) {
        pIVar51->NavMoveDir = 3;
      }
    }
    pIVar51->NavMoveClipDir = pIVar51->NavMoveDir;
    (pIVar51->NavScoringNoClipRect).Min.x = 3.4028235e+38;
    (pIVar51->NavScoringNoClipRect).Min.y = 3.4028235e+38;
    (pIVar51->NavScoringNoClipRect).Max.x = -3.4028235e+38;
    (pIVar51->NavScoringNoClipRect).Max.y = -3.4028235e+38;
  }
  auVar76 = ZEXT816(0) << 0x40;
  if ((((pIVar56 != (ImGuiWindow *)0x0) && (pIVar51->NavMoveDir == -1)) &&
      (((pIVar51->IO).ConfigFlags & 1U) != 0)) &&
     (((pIVar56->Flags & 0x40000) == 0 && (pIVar51->NavWindowingTarget == (ImGuiWindow *)0x0)))) {
    lVar66 = (long)(pIVar51->IO).KeyMap[5];
    bVar69 = false;
    bVar52 = false;
    if ((-1 < lVar66) && ((pIVar51->IO).KeysDown[lVar66] == true)) {
      bVar52 = (pIVar51->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    lVar66 = (long)(pIVar51->IO).KeyMap[6];
    if ((-1 < lVar66) && ((pIVar51->IO).KeysDown[lVar66] == true)) {
      bVar69 = (pIVar51->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar53 = IsKeyPressed((pIVar51->IO).KeyMap[7],true);
    if (bVar53) {
      bVar53 = (pIVar51->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar53 = false;
    }
    bVar54 = IsKeyPressed((pIVar51->IO).KeyMap[8],true);
    if (bVar54) {
      bVar54 = (pIVar51->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar54 = false;
    }
    if ((bVar52 != bVar69) || (auVar76 = ZEXT816(0) << 0x40, bVar53 != bVar54)) {
      if (pIVar51->NavLayer != ImGuiNavLayer_Main) {
        NavRestoreLayer(ImGuiNavLayer_Main);
      }
      if (((pIVar56->DC).NavLayersActiveMask == 0) && ((pIVar56->DC).NavHasScroll == true)) {
        bVar69 = IsKeyPressed((pIVar51->IO).KeyMap[5],true);
        if (bVar69) {
          fVar93 = (pIVar56->Scroll).y - ((pIVar56->InnerRect).Max.y - (pIVar56->InnerRect).Min.y);
        }
        else {
          bVar69 = IsKeyPressed((pIVar51->IO).KeyMap[6],true);
          if (!bVar69) {
            if (bVar53 == false) {
              auVar76 = SUB6416(ZEXT864(0),0);
              if (bVar54 != false) {
                (pIVar56->ScrollTarget).y = (pIVar56->ScrollMax).y;
                (pIVar56->ScrollTargetCenterRatio).y = 0.0;
                (pIVar56->ScrollTargetEdgeSnapDist).y = 0.0;
              }
            }
            else {
              (pIVar56->ScrollTarget).y = 0.0;
              (pIVar56->ScrollTargetCenterRatio).y = 0.0;
              (pIVar56->ScrollTargetEdgeSnapDist).y = 0.0;
              auVar76 = SUB6416(ZEXT864(0),0);
            }
            goto LAB_002b8b17;
          }
          fVar93 = ((pIVar56->InnerRect).Max.y - (pIVar56->InnerRect).Min.y) + (pIVar56->Scroll).y;
        }
        (pIVar56->ScrollTarget).y = fVar93;
        (pIVar56->ScrollTargetCenterRatio).y = 0.0;
        (pIVar56->ScrollTargetEdgeSnapDist).y = 0.0;
        auVar76 = ZEXT816(0) << 0x40;
      }
      else {
        pIVar7 = pIVar56->NavRectRel + pIVar51->NavLayer;
        fVar93 = GImGui->FontBaseSize * pIVar56->FontWindowScale;
        if (pIVar56->ParentWindow != (ImGuiWindow *)0x0) {
          fVar93 = fVar93 * pIVar56->ParentWindow->FontWindowScale;
        }
        fVar93 = (((pIVar56->InnerRect).Max.y - (pIVar56->InnerRect).Min.y) - fVar93) +
                 ((pIVar7->Max).y - (pIVar7->Min).y);
        auVar101._0_12_ = ZEXT812(0);
        auVar101._12_4_ = 0;
        uVar40 = vcmpss_avx512f(ZEXT416((uint)fVar93),auVar101,2);
        auVar88._16_48_ = auVar80._16_48_;
        auVar88._0_16_ = ZEXT416((uint)fVar93);
        auVar80._4_60_ = auVar88._4_60_;
        auVar80._0_4_ = (float)((uint)!(bool)((byte)uVar40 & 1) * (int)fVar93);
        auVar76 = auVar80._0_16_;
        bVar69 = IsKeyPressed((pIVar51->IO).KeyMap[5],true);
        if (bVar69) {
          auVar43._8_4_ = 0x80000000;
          auVar43._0_8_ = 0x8000000080000000;
          auVar43._12_4_ = 0x80000000;
          auVar80._0_16_ = vxorps_avx512vl(auVar76,auVar43);
          pIVar51->NavMoveDir = 3;
          pIVar51->NavMoveClipDir = 2;
          pIVar51->NavMoveFlags = 0x30;
          auVar76 = auVar80._0_16_;
        }
        else {
          bVar69 = IsKeyPressed((pIVar51->IO).KeyMap[6],true);
          if (bVar69) {
            pIVar51->NavMoveDir = 2;
            pIVar51->NavMoveClipDir = 3;
            pIVar51->NavMoveFlags = 0x30;
          }
          else {
            if (bVar53 == false) {
              if (bVar54 != false) {
                fVar93 = (pIVar56->ContentSize).y;
                (pIVar7->Max).y = fVar93;
                (pIVar7->Min).y = fVar93;
                if ((pIVar7->Max).x < (pIVar7->Min).x) {
                  (pIVar7->Max).x = 0.0;
                  (pIVar7->Min).x = 0.0;
                }
                pIVar51->NavMoveDir = 2;
                pIVar51->NavMoveFlags = 0x50;
              }
            }
            else {
              (pIVar7->Max).y = 0.0;
              (pIVar7->Min).y = 0.0;
              if ((pIVar7->Max).x < (pIVar7->Min).x) {
                (pIVar7->Max).x = 0.0;
                (pIVar7->Min).x = 0.0;
              }
              pIVar51->NavMoveDir = 3;
              pIVar51->NavMoveFlags = 0x50;
            }
            auVar76 = SUB6416(ZEXT864(0),0);
          }
        }
      }
    }
  }
LAB_002b8b17:
  fVar93 = auVar76._0_4_;
  if ((fVar93 != 0.0) || (NAN(fVar93))) {
    IVar13 = (pIVar56->InnerRect).Max;
    (pIVar51->NavScoringNoClipRect).Min = (pIVar56->InnerRect).Min;
    (pIVar51->NavScoringNoClipRect).Max = IVar13;
    (pIVar51->NavScoringNoClipRect).Min.y = fVar93 + (pIVar51->NavScoringNoClipRect).Min.y;
    (pIVar51->NavScoringNoClipRect).Max.y = fVar93 + (pIVar51->NavScoringNoClipRect).Max.y;
  }
  pIVar51->NavMoveForwardToNextFrame = false;
  if (pIVar51->NavMoveDir != -1) {
    NavMoveRequestSubmit
              (pIVar51->NavMoveDir,pIVar51->NavMoveClipDir,pIVar51->NavMoveFlags,
               pIVar51->NavMoveScrollFlags);
  }
  if (pIVar51->NavMoveSubmitted == true) {
    if (pIVar51->NavId == 0) {
      pIVar51->NavInitRequest = true;
      pIVar51->NavInitRequestFromMove = true;
      pIVar51->NavInitResultId = 0;
      pIVar51->NavDisableHighlight = false;
    }
    if ((pIVar51->NavInputSource == ImGuiInputSource_Gamepad) &&
       (uVar73 = (ulong)pIVar51->NavLayer, uVar73 == 0 && pIVar56 != (ImGuiWindow *)0x0)) {
      auVar122._8_8_ = 0;
      auVar122._0_4_ = (pIVar56->DC).CursorStartPos.x;
      auVar122._4_4_ = (pIVar56->DC).CursorStartPos.y;
      auVar102._8_8_ = 0;
      auVar102._0_4_ = (pIVar56->InnerRect).Min.x;
      auVar102._4_4_ = (pIVar56->InnerRect).Min.y;
      auVar130._8_8_ = 0;
      auVar130._0_4_ = (pIVar56->InnerRect).Max.x;
      auVar130._4_4_ = (pIVar56->InnerRect).Max.y;
      auVar41._8_4_ = 0xbf800000;
      auVar41._0_8_ = 0xbf800000bf800000;
      auVar41._12_4_ = 0xbf800000;
      auVar76 = vaddps_avx512vl(auVar102,auVar41);
      auVar42._8_4_ = 0x3f800000;
      auVar42._0_8_ = 0x3f8000003f800000;
      auVar42._12_4_ = 0x3f800000;
      auVar80._0_16_ = vaddps_avx512vl(auVar130,auVar42);
      auVar76 = vsubps_avx(auVar76,auVar122);
      auVar74 = vsubps_avx(auVar80._0_16_,auVar122);
      pIVar7 = pIVar56->NavRectRel + uVar73;
      fVar94 = pIVar56->NavRectRel[uVar73].Min.x;
      if ((fVar94 < auVar76._0_4_) ||
         (((auVar119 = vmovshdup_avx(auVar76), (pIVar7->Min).y < auVar119._0_4_ ||
           (auVar74._0_4_ < (pIVar7->Max).x)) ||
          (auVar119 = vmovshdup_avx(auVar74), auVar119._0_4_ < (pIVar7->Max).y)))) {
        fVar126 = GImGui->FontBaseSize * pIVar56->FontWindowScale;
        if (pIVar56->ParentWindow != (ImGuiWindow *)0x0) {
          fVar126 = fVar126 * pIVar56->ParentWindow->FontWindowScale;
        }
        fVar126 = fVar126 * 0.5;
        auVar119 = vsubps_avx(auVar74,auVar76);
        auVar136._4_4_ = fVar126;
        auVar136._0_4_ = fVar126;
        auVar136._8_4_ = fVar126;
        auVar136._12_4_ = fVar126;
        auVar119 = vminps_avx(auVar119,auVar136);
        auVar103._0_4_ = auVar76._0_4_ + auVar119._0_4_;
        auVar103._4_4_ = auVar76._4_4_ + auVar119._4_4_;
        auVar103._8_4_ = auVar76._8_4_ + auVar119._8_4_;
        auVar103._12_4_ = auVar76._12_4_ + auVar119._12_4_;
        auVar74 = vsubps_avx(auVar74,auVar119);
        auVar76 = vinsertps_avx(ZEXT416((uint)fVar94),ZEXT416((uint)(pIVar7->Min).y),0x10);
        uVar73 = vcmpps_avx512vl(auVar76,auVar103,1);
        auVar76 = vminps_avx(auVar74,auVar76);
        bVar69 = (bool)((byte)uVar73 & 1);
        auVar77._0_4_ = (uint)bVar69 * (int)auVar103._0_4_ | (uint)!bVar69 * auVar76._0_4_;
        bVar69 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar77._4_4_ = (uint)bVar69 * (int)auVar103._4_4_ | (uint)!bVar69 * auVar76._4_4_;
        bVar69 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar77._8_4_ = (uint)bVar69 * (int)auVar103._8_4_ | (uint)!bVar69 * auVar76._8_4_;
        bVar69 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar77._12_4_ = (uint)bVar69 * (int)auVar103._12_4_ | (uint)!bVar69 * auVar76._12_4_;
        auVar137._8_8_ = 0;
        auVar137._0_4_ = (pIVar7->Max).x;
        auVar137._4_4_ = (pIVar7->Max).y;
        uVar73 = vcmpps_avx512vl(auVar137,auVar103,1);
        auVar76 = vminps_avx(auVar74,auVar137);
        bVar69 = (bool)((byte)uVar73 & 1);
        auVar78._0_4_ = (uint)bVar69 * (int)auVar103._0_4_ | (uint)!bVar69 * auVar76._0_4_;
        bVar69 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar78._4_4_ = (uint)bVar69 * (int)auVar103._4_4_ | (uint)!bVar69 * auVar76._4_4_;
        bVar69 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar78._8_4_ = (uint)bVar69 * (int)auVar103._8_4_ | (uint)!bVar69 * auVar76._8_4_;
        bVar69 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar78._12_4_ = (uint)bVar69 * (int)auVar103._12_4_ | (uint)!bVar69 * auVar76._12_4_;
        auVar80._0_16_ = auVar78;
        IVar36 = (ImRect)vmovlhps_avx(auVar77,auVar78);
        *pIVar7 = IVar36;
        pIVar51->NavId = 0;
        pIVar51->NavFocusScopeId = 0;
      }
    }
  }
  if (pIVar56 == (ImGuiWindow *)0x0) {
    auVar74 = ZEXT816(0) << 0x40;
    auVar76 = ZEXT816(0) << 0x40;
  }
  else {
    IVar64 = pIVar51->NavLayer;
    fVar94 = pIVar56->NavRectRel[IVar64].Max.x;
    fVar126 = pIVar56->NavRectRel[IVar64].Min.x;
    fVar134 = pIVar56->NavRectRel[IVar64].Min.y;
    fVar10 = pIVar56->NavRectRel[IVar64].Max.y;
    uVar40 = vcmpps_avx512vl(ZEXT416((uint)fVar10),ZEXT416((uint)fVar134),1);
    uVar37 = vcmpps_avx512vl(ZEXT416((uint)fVar94),ZEXT416((uint)fVar126),1);
    bVar70 = (byte)uVar37 | (byte)uVar40;
    auVar89._16_48_ = auVar80._16_48_;
    auVar89._0_16_ = ZEXT416((uint)fVar126);
    fVar126 = (float)((uint)!(bool)(bVar70 & 1) * (int)fVar126);
    auVar80._4_60_ = auVar89._4_60_;
    auVar80._0_4_ = fVar126;
    fVar11 = (pIVar56->DC).CursorStartPos.x;
    fVar12 = (pIVar56->DC).CursorStartPos.y;
    auVar74 = vminss_avx(ZEXT416((uint)(fVar11 + fVar126 + 1.0)),
                         ZEXT416((uint)(fVar11 + (float)((uint)!(bool)(bVar70 & 1) * (int)fVar94))))
    ;
    auVar76 = vinsertps_avx(auVar74,ZEXT416((uint)(fVar93 + fVar12 + (float)((uint)!(bool)(bVar70 & 
                                                  1) * (int)fVar134))),0x10);
    auVar74 = vinsertps_avx(auVar74,ZEXT416((uint)(fVar93 + fVar12 + (float)((uint)!(bool)(bVar70 & 
                                                  1) * (int)fVar10))),0x10);
  }
  IVar36 = (ImRect)vmovlhps_avx(auVar76,auVar74);
  pIVar51->NavScoringRect = IVar36;
  if (auVar76._0_4_ < (pIVar51->NavScoringNoClipRect).Min.x) {
    (pIVar51->NavScoringNoClipRect).Min.x = auVar76._0_4_;
  }
  auVar76 = vmovshdup_avx(auVar76);
  if (auVar76._0_4_ < (pIVar51->NavScoringNoClipRect).Min.y) {
    (pIVar51->NavScoringNoClipRect).Min.y = auVar76._0_4_;
  }
  if ((pIVar51->NavScoringNoClipRect).Max.x < auVar74._0_4_) {
    (pIVar51->NavScoringNoClipRect).Max.x = auVar74._0_4_;
  }
  auVar76 = vmovshdup_avx(auVar74);
  if ((pIVar51->NavScoringNoClipRect).Max.y < auVar76._0_4_) {
    (pIVar51->NavScoringNoClipRect).Max.y = auVar76._0_4_;
  }
  pIVar51 = GImGui;
  if (((((pIVar49->NavMoveDir == -1) && (pIVar56 = GImGui->NavWindow, pIVar56 != (ImGuiWindow *)0x0)
        ) && ((GImGui->NavWindowingTarget == (ImGuiWindow *)0x0 &&
              (((pIVar56->Flags & 0x40000) == 0 && (iVar62 = (GImGui->IO).KeyMap[0], -1 < iVar62))))
             )) && (bVar69 = IsKeyPressed(iVar62,true), bVar69)) &&
     ((((pIVar51->ActiveIdUsingKeyInputMask & 1) == 0 && ((pIVar51->IO).KeyCtrl == false)) &&
      ((pIVar51->IO).KeyAlt == false)))) {
    uVar55 = 0xffffffff;
    if ((pIVar51->IO).KeyShift == false) {
      uVar55 = (uint)(pIVar51->ActiveId != 0);
    }
    pIVar51->NavTabbingDir = uVar55;
    scroll_flags = 3;
    if (pIVar56->Appearing != false) {
      scroll_flags = 0x21;
    }
    NavMoveRequestSubmit(-1,uVar55 >> 0x1f ^ 3,0x400,scroll_flags);
    (pIVar51->NavTabbingResultFirst).InFlags = 0;
    (pIVar51->NavTabbingResultFirst).Window = (ImGuiWindow *)0x0;
    (pIVar51->NavTabbingResultFirst).ID = 0;
    (pIVar51->NavTabbingResultFirst).FocusScopeId = 0;
    (pIVar51->NavTabbingResultFirst).DistAxial = 3.4028235e+38;
    auVar111._8_4_ = 0x7f7fffff;
    auVar111._0_8_ = 0x7f7fffff7f7fffff;
    auVar111._12_4_ = 0x7f7fffff;
    uVar40 = vmovlps_avx(auVar111);
    (pIVar51->NavTabbingResultFirst).DistBox = (float)(int)uVar40;
    (pIVar51->NavTabbingResultFirst).DistCenter = (float)(int)((ulong)uVar40 >> 0x20);
    pIVar51->NavTabbingCounter = -1;
  }
  pIVar51 = GImGui;
  bVar69 = true;
  if (GImGui->NavMoveScoringItems == false) {
    bVar69 = GImGui->NavInitRequest;
  }
  GImGui->NavAnyRequest = bVar69;
  pIVar49->NavIdIsAlive = false;
  pIVar56 = pIVar49->NavWindow;
  if (((pIVar56 != (ImGuiWindow *)0x0) && ((pIVar56->Flags & 0x40000) == 0)) &&
     (pIVar49->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar93 = pIVar51->FontBaseSize * pIVar56->FontWindowScale;
    if (pIVar56->ParentWindow != (ImGuiWindow *)0x0) {
      fVar93 = fVar93 * pIVar56->ParentWindow->FontWindowScale;
    }
    auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pIVar49->IO).DeltaTime),ZEXT416((uint)(fVar93 * 100.0))
                              ,ZEXT416(0x3f000000));
    auVar104._0_4_ = (int)auVar76._0_4_;
    auVar104._4_4_ = (int)auVar76._4_4_;
    auVar104._8_4_ = (int)auVar76._8_4_;
    auVar104._12_4_ = (int)auVar76._12_4_;
    auVar76 = vcvtdq2ps_avx(auVar104);
    if (((pIVar56->DC).NavLayersActiveMask == 0) &&
       (uVar55 = pIVar49->NavMoveDir, (uVar55 != 0xffffffff & (pIVar56->DC).NavHasScroll) == 1)) {
      if (uVar55 < 2) {
        auVar74 = vfmadd213ss_fma(ZEXT416(*(uint *)(&DAT_0034afa0 + (ulong)(uVar55 == 0) * 4)),
                                  auVar76,ZEXT416((uint)(pIVar56->Scroll).x));
        auVar105._0_4_ = (int)auVar74._0_4_;
        auVar105._4_4_ = (int)auVar74._4_4_;
        auVar105._8_4_ = (int)auVar74._8_4_;
        auVar105._12_4_ = (int)auVar74._12_4_;
        auVar74 = vcvtdq2ps_avx(auVar105);
        (pIVar56->ScrollTarget).x = auVar74._0_4_;
        (pIVar56->ScrollTargetCenterRatio).x = 0.0;
        (pIVar56->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((uVar55 & 0xfffffffe) == 2) {
        auVar74 = vfmadd213ss_fma(ZEXT416(*(uint *)(&DAT_0034afa0 + (ulong)(uVar55 == 2) * 4)),
                                  auVar76,ZEXT416((uint)(pIVar56->Scroll).y));
        auVar106._0_4_ = (int)auVar74._0_4_;
        auVar106._4_4_ = (int)auVar74._4_4_;
        auVar106._8_4_ = (int)auVar74._8_4_;
        auVar106._12_4_ = (int)auVar74._12_4_;
        auVar74 = vcvtdq2ps_avx(auVar106);
        (pIVar56->ScrollTarget).y = auVar74._0_4_;
        (pIVar56->ScrollTargetCenterRatio).y = 0.0;
        (pIVar56->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
    auVar116._0_8_ = GetNavInputAmount2d(8,ImGuiInputReadMode_Down,0.1,10.0);
    auVar116._8_56_ = extraout_var_00;
    if (((auVar116._0_4_ != 0.0) || (NAN(auVar116._0_4_))) && (pIVar56->ScrollbarX == true)) {
      auVar74 = vfmadd231ss_fma(ZEXT416((uint)(pIVar56->Scroll).x),auVar116._0_16_,auVar76);
      auVar131._0_4_ = (int)auVar74._0_4_;
      auVar131._4_4_ = (int)auVar74._4_4_;
      auVar131._8_4_ = (int)auVar74._8_4_;
      auVar131._12_4_ = (int)auVar74._12_4_;
      auVar74 = vcvtdq2ps_avx(auVar131);
      (pIVar56->ScrollTarget).x = auVar74._0_4_;
      (pIVar56->ScrollTargetCenterRatio).x = 0.0;
      (pIVar56->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    auVar74 = vmovshdup_avx(auVar116._0_16_);
    if ((auVar74._0_4_ != 0.0) || (NAN(auVar74._0_4_))) {
      auVar76 = vfmadd213ss_fma(auVar76,auVar74,ZEXT416((uint)(pIVar56->Scroll).y));
      auVar107._0_4_ = (int)auVar76._0_4_;
      auVar107._4_4_ = (int)auVar76._4_4_;
      auVar107._8_4_ = (int)auVar76._8_4_;
      auVar107._12_4_ = (int)auVar76._12_4_;
      auVar76 = vcvtdq2ps_avx(auVar107);
      (pIVar56->ScrollTarget).y = auVar76._0_4_;
      (pIVar56->ScrollTargetCenterRatio).y = 0.0;
      (pIVar56->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  if ((uVar58 & 1) == 0 && bVar61 == 0) {
    pIVar49->NavDisableHighlight = true;
    pIVar49->NavDisableMouseHover = false;
  }
  else if (((bVar68) && (((pIVar49->IO).ConfigFlags & 4) != 0)) &&
          (((pIVar49->IO).BackendFlags & 4) != 0)) {
    auVar117._0_8_ = NavCalcPreferredRefPos();
    auVar117._8_56_ = extraout_var_01;
    IVar13 = (ImVec2)vmovlps_avx(auVar117._0_16_);
    (pIVar49->IO).MousePosPrev = IVar13;
    IVar13 = (ImVec2)vmovlps_avx(auVar117._0_16_);
    (pIVar49->IO).MousePos = IVar13;
    (pIVar49->IO).WantSetMousePos = true;
  }
  pIVar49->NavScoringDebugCount = 0;
  pIVar49 = GImGui;
  IVar13 = (GImGui->IO).MousePos;
  auVar108._8_8_ = 0;
  auVar108._0_4_ = IVar13.x;
  auVar108._4_4_ = IVar13.y;
  if ((-256000.0 <= IVar13.x) && (auVar76 = vmovshdup_avx(auVar108), -256000.0 <= auVar76._0_4_)) {
    auVar109._0_4_ = (int)IVar13.x;
    auVar109._4_4_ = (int)IVar13.y;
    auVar109._8_8_ = 0;
    auVar76 = vcvtdq2ps_avx(auVar109);
    IVar13 = (ImVec2)vmovlps_avx(auVar76);
    GImGui->MouseLastValidPos = IVar13;
    IVar13 = (ImVec2)vmovlps_avx(auVar76);
    (pIVar49->IO).MousePos = IVar13;
  }
  IVar13 = (pIVar49->IO).MousePos;
  auVar110._8_8_ = 0;
  auVar110._0_4_ = IVar13.x;
  auVar110._4_4_ = IVar13.y;
  auVar76 = vmovshdup_avx(auVar110);
  fVar93 = auVar76._0_4_;
  if ((((IVar13.x < -256000.0) || (fVar93 < -256000.0)) ||
      (IVar14 = (pIVar49->IO).MousePosPrev, auVar132._8_8_ = 0, auVar132._0_4_ = IVar14.x,
      auVar132._4_4_ = IVar14.y, IVar14.x < -256000.0)) ||
     (auVar76 = vmovshdup_avx(auVar132), auVar76._0_4_ < -256000.0)) {
    (pIVar49->IO).MouseDelta.x = 0.0;
    (pIVar49->IO).MouseDelta.y = 0.0;
  }
  else {
    auVar76 = vsubps_avx(auVar110,auVar132);
    IVar14 = (ImVec2)vmovlps_avx(auVar76);
    (pIVar49->IO).MouseDelta = IVar14;
  }
  if ((((pIVar49->IO).MouseDelta.x != 0.0) || (fVar94 = (pIVar49->IO).MouseDelta.y, fVar94 != 0.0))
     || (NAN(fVar94))) {
    pIVar49->NavDisableMouseHover = false;
  }
  IVar14 = (pIVar49->IO).MousePos;
  (pIVar49->IO).MousePosPrev = IVar14;
  lVar66 = 0;
  do {
    bVar68 = (pIVar49->IO).MouseDown[lVar66];
    if (bVar68 == true) {
      bVar69 = (pIVar49->IO).MouseDownDuration[lVar66] < 0.0;
    }
    else {
      bVar69 = false;
    }
    (pIVar49->IO).MouseClicked[lVar66] = bVar69;
    (pIVar49->IO).MouseClickedCount[lVar66] = 0;
    if (bVar68 == false) {
      bVar52 = 0.0 <= (pIVar49->IO).MouseDownDuration[lVar66];
    }
    else {
      bVar52 = false;
    }
    (pIVar49->IO).MouseReleased[lVar66] = bVar52;
    fVar94 = (pIVar49->IO).MouseDownDuration[lVar66];
    (pIVar49->IO).MouseDownDurationPrev[lVar66] = fVar94;
    fVar126 = -1.0;
    if ((bVar68 != false) && (fVar126 = 0.0, 0.0 <= fVar94)) {
      fVar126 = fVar94 + (pIVar49->IO).DeltaTime;
    }
    (pIVar49->IO).MouseDownDuration[lVar66] = fVar126;
    if (bVar69 == false) {
      if (bVar68 != false) {
        fVar94 = (pIVar49->IO).MousePos.x;
        auVar140._0_12_ = ZEXT812(0);
        auVar140._12_4_ = 0;
        if ((-256000.0 <= fVar94) && (-256000.0 <= fVar93)) {
          pIVar8 = (pIVar49->IO).MouseClickedPos + lVar66;
          auVar141._8_8_ = 0;
          auVar141._0_4_ = pIVar8->x;
          auVar141._4_4_ = pIVar8->y;
          auVar143._4_4_ = IVar13.y;
          auVar143._0_4_ = fVar94;
          auVar143._8_8_ = 0;
          auVar140 = vsubps_avx(auVar143,auVar141);
        }
        fVar94 = (pIVar49->IO).MouseDragMaxDistanceSqr[lVar66];
        auVar147._0_4_ = auVar140._0_4_ * auVar140._0_4_;
        auVar147._4_4_ = auVar140._4_4_ * auVar140._4_4_;
        fVar126 = auVar140._8_4_;
        auVar147._8_4_ = fVar126 * fVar126;
        fVar134 = auVar140._12_4_;
        auVar147._12_4_ = fVar134 * fVar134;
        auVar76 = vmovshdup_avx(auVar147);
        auVar76 = vfmadd231ss_fma(auVar76,auVar140,auVar140);
        uVar40 = vcmpss_avx512f(auVar76,ZEXT416((uint)fVar94),2);
        bVar68 = (bool)((byte)uVar40 & 1);
        (pIVar49->IO).MouseDragMaxDistanceSqr[lVar66] =
             (float)((uint)bVar68 * (int)fVar94 + (uint)!bVar68 * auVar76._0_4_);
        IVar16 = (pIVar49->IO).MouseDragMaxDistanceAbs[lVar66];
        auVar144._8_8_ = 0;
        auVar144._0_4_ = IVar16.x;
        auVar144._4_4_ = IVar16.y;
        auVar148._0_8_ = auVar140._0_8_ ^ 0x8000000080000000;
        auVar148._8_4_ = -fVar126;
        auVar148._12_4_ = -fVar134;
        auVar76 = vmaxps_avx(auVar148,auVar140);
        uVar73 = vcmpps_avx512vl(auVar76,auVar144,2);
        bVar68 = (bool)((byte)uVar73 & 1);
        auVar79._0_4_ = (uint)bVar68 * (int)IVar16.x | (uint)!bVar68 * auVar76._0_4_;
        bVar68 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar79._4_4_ = (uint)bVar68 * (int)IVar16.y | (uint)!bVar68 * auVar76._4_4_;
        auVar79._8_4_ = (uint)!(bool)((byte)(uVar73 >> 2) & 1) * auVar76._8_4_;
        auVar79._12_4_ = (uint)!(bool)((byte)(uVar73 >> 3) & 1) * auVar76._12_4_;
        auVar80._0_16_ = auVar79;
        IVar16 = (ImVec2)vmovlps_avx(auVar79);
        (pIVar49->IO).MouseDragMaxDistanceAbs[lVar66] = IVar16;
      }
    }
    else {
      dVar15 = pIVar49->Time;
      if ((pIVar49->IO).MouseDoubleClickTime <=
          (float)(dVar15 - (pIVar49->IO).MouseClickedTime[lVar66])) {
LAB_002b92b3:
        (pIVar49->IO).MouseClickedLastCount[lVar66] = 1;
      }
      else {
        fVar94 = (pIVar49->IO).MousePos.x;
        auVar76 = ZEXT416(0) << 0x20;
        if ((-256000.0 <= fVar94) && (-256000.0 <= fVar93)) {
          pIVar8 = (pIVar49->IO).MouseClickedPos + lVar66;
          auVar142._8_8_ = 0;
          auVar142._0_4_ = pIVar8->x;
          auVar142._4_4_ = pIVar8->y;
          auVar145._4_4_ = IVar13.y;
          auVar145._0_4_ = fVar94;
          auVar145._8_8_ = 0;
          auVar76 = vsubps_avx(auVar145,auVar142);
        }
        auVar146._0_4_ = auVar76._0_4_ * auVar76._0_4_;
        auVar146._4_4_ = auVar76._4_4_ * auVar76._4_4_;
        auVar146._8_4_ = auVar76._8_4_ * auVar76._8_4_;
        auVar146._12_4_ = auVar76._12_4_ * auVar76._12_4_;
        auVar74 = vmovshdup_avx(auVar146);
        auVar76 = vfmadd231ss_fma(auVar74,auVar76,auVar76);
        fVar94 = (pIVar49->IO).MouseDoubleClickMaxDist;
        if (fVar94 * fVar94 <= auVar76._0_4_) goto LAB_002b92b3;
        pIVar9 = (pIVar49->IO).MouseClickedLastCount + lVar66;
        *pIVar9 = *pIVar9 + 1;
      }
      (pIVar49->IO).MouseClickedTime[lVar66] = dVar15;
      (pIVar49->IO).MouseClickedPos[lVar66] = IVar14;
      (pIVar49->IO).MouseClickedCount[lVar66] = (pIVar49->IO).MouseClickedLastCount[lVar66];
      pIVar8 = (pIVar49->IO).MouseDragMaxDistanceAbs + lVar66;
      pIVar8->x = 0.0;
      pIVar8->y = 0.0;
      (pIVar49->IO).MouseDragMaxDistanceSqr[lVar66] = 0.0;
    }
    auVar92 = auVar80._16_48_;
    (pIVar49->IO).MouseDoubleClicked[lVar66] = (pIVar49->IO).MouseClickedCount[lVar66] == 2;
    if ((pIVar49->IO).MouseClicked[lVar66] == true) {
      pIVar49->NavDisableMouseHover = false;
    }
    lVar66 = lVar66 + 1;
    if (lVar66 == 5) {
      UpdateHoveredWindowAndCaptureFlags();
      UpdateMouseMovingWindowNewFrame();
      pIVar56 = GetTopMostPopupModal();
      if ((pIVar56 != (ImGuiWindow *)0x0) ||
         ((pIVar48->NavWindowingTarget != (ImGuiWindow *)0x0 &&
          (0.0 < pIVar48->NavWindowingHighlightAlpha)))) {
        auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40c00000),0),
                                  ZEXT416((uint)(pIVar48->IO).DeltaTime),
                                  ZEXT416((uint)pIVar48->DimBgRatio));
        auVar76 = vminss_avx(auVar76,ZEXT416(0x3f800000));
        fVar93 = auVar76._0_4_;
      }
      else {
        auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1200000),0),
                                  ZEXT416((uint)(pIVar48->IO).DeltaTime),
                                  ZEXT416((uint)pIVar48->DimBgRatio));
        uVar40 = vcmpss_avx512f(ZEXT816(0),auVar76,2);
        fVar93 = (float)((uint)((byte)uVar40 & 1) * auVar76._0_4_);
      }
      pIVar48->DimBgRatio = fVar93;
      pIVar48->MouseCursor = 0;
      pIVar48->WantTextInputNextFrame = -1;
      pIVar48->WantCaptureMouseNextFrame = -1;
      pIVar48->WantCaptureKeyboardNextFrame = -1;
      (pIVar48->PlatformImePos).x = 1.0;
      pIVar49 = GImGui;
      (pIVar48->PlatformImePos).y = 1.0;
      if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
        GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
        fVar93 = (pIVar49->IO).MousePos.x;
        if (((-256000.0 <= fVar93) && (fVar94 = (pIVar49->IO).MousePos.y, -256000.0 <= fVar94)) &&
           (fVar94 = fVar94 - (pIVar49->WheelingWindowRefMousePos).y,
           auVar76 = ZEXT416((uint)(fVar93 - (pIVar49->WheelingWindowRefMousePos).x)),
           auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar94 * fVar94)),auVar76,auVar76),
           fVar93 = (pIVar49->IO).MouseDragThreshold, fVar93 * fVar93 < auVar76._0_4_)) {
          pIVar49->WheelingWindowTimer = 0.0;
        }
        if (pIVar49->WheelingWindowTimer <= 0.0) {
          pIVar49->WheelingWindow = (ImGuiWindow *)0x0;
          pIVar49->WheelingWindowTimer = 0.0;
        }
      }
      fVar93 = (pIVar49->IO).MouseWheel;
      if ((((fVar93 != 0.0) || (fVar94 = (pIVar49->IO).MouseWheelH, fVar94 != 0.0)) || (NAN(fVar94))
          ) && (((pIVar49->ActiveId == 0 || (pIVar49->ActiveIdUsingMouseWheel == false)) &&
                ((pIVar49->HoveredIdPreviousFrame == 0 ||
                 (pIVar49->HoveredIdPreviousFrameUsingMouseWheel == false)))))) {
        pIVar56 = pIVar49->WheelingWindow;
        pIVar60 = pIVar56;
        if (pIVar56 == (ImGuiWindow *)0x0) {
          pIVar60 = pIVar49->HoveredWindow;
        }
        if ((pIVar60 != (ImGuiWindow *)0x0) && (pIVar60->Collapsed == false)) {
          if (((fVar93 == 0.0) && (!NAN(fVar93))) ||
             (((pIVar49->IO).KeyCtrl != true || ((pIVar49->IO).FontAllowUserScaling != true)))) {
            if ((pIVar49->IO).KeyCtrl == false) {
              if ((pIVar49->IO).KeyShift == true) {
                bVar61 = (pIVar49->IO).ConfigMacOSXBehaviors ^ 1;
              }
              else {
                bVar61 = 0;
              }
              auVar91._16_48_ = auVar92;
              auVar91._0_16_ = ZEXT416((uint)fVar93);
              fVar93 = (float)((uint)!(bool)(bVar61 & 1) * (int)fVar93);
              auVar90._4_60_ = auVar91._4_60_;
              auVar90._0_4_ = fVar93;
              fVar94 = *(float *)((pIVar49->IO).MouseDown + (ulong)(bVar61 ^ 1) * 4 + 8);
              if ((fVar93 != 0.0) || (NAN(fVar93))) {
                if (pIVar56 != pIVar60) {
                  pIVar49->WheelingWindow = pIVar60;
                  pIVar49->WheelingWindowRefMousePos = (pIVar49->IO).MousePos;
                  pIVar49->WheelingWindowTimer = 2.0;
                }
                uVar58 = pIVar60->Flags;
                while (((uVar58 >> 0x18 & 1) != 0 &&
                       (((uVar58 & 0x210) == 0x10 ||
                        ((fVar93 = (pIVar60->ScrollMax).y, fVar93 == 0.0 && (!NAN(fVar93)))))))) {
                  pIVar60 = pIVar60->ParentWindow;
                  uVar58 = pIVar60->Flags;
                }
                if ((uVar58 & 0x210) == 0) {
                  fVar93 = pIVar49->FontBaseSize * pIVar60->FontWindowScale;
                  if (pIVar60->ParentWindow != (ImGuiWindow *)0x0) {
                    fVar93 = fVar93 * pIVar60->ParentWindow->FontWindowScale;
                  }
                  auVar76 = vminss_avx(ZEXT416((uint)(fVar93 * 5.0)),
                                       ZEXT416((uint)(((pIVar60->InnerRect).Max.y -
                                                      (pIVar60->InnerRect).Min.y) * 0.67)));
                  auVar139._0_4_ = (int)auVar76._0_4_;
                  auVar139._4_4_ = (int)auVar76._4_4_;
                  auVar139._8_4_ = (int)auVar76._8_4_;
                  auVar139._12_4_ = (int)auVar76._12_4_;
                  auVar76 = vcvtdq2ps_avx(auVar139);
                  auVar76 = vfnmadd213ss_fma(auVar76,auVar90._0_16_,
                                             ZEXT416((uint)(pIVar60->Scroll).y));
                  (pIVar60->ScrollTarget).y = auVar76._0_4_;
                  (pIVar60->ScrollTargetCenterRatio).y = 0.0;
                  (pIVar60->ScrollTargetEdgeSnapDist).y = 0.0;
                }
              }
              if ((fVar94 != 0.0) || (NAN(fVar94))) {
                if (pIVar49->WheelingWindow != pIVar60) {
                  pIVar49->WheelingWindow = pIVar60;
                  pIVar49->WheelingWindowRefMousePos = (pIVar49->IO).MousePos;
                  pIVar49->WheelingWindowTimer = 2.0;
                }
                uVar58 = pIVar60->Flags;
                while (((uVar58 >> 0x18 & 1) != 0 &&
                       (((uVar58 & 0x210) == 0x10 ||
                        ((fVar93 = (pIVar60->ScrollMax).x, fVar93 == 0.0 && (!NAN(fVar93)))))))) {
                  pIVar60 = pIVar60->ParentWindow;
                  uVar58 = pIVar60->Flags;
                }
                if ((uVar58 & 0x210) == 0) {
                  fVar93 = pIVar49->FontBaseSize * pIVar60->FontWindowScale;
                  if (pIVar60->ParentWindow != (ImGuiWindow *)0x0) {
                    fVar93 = fVar93 * pIVar60->ParentWindow->FontWindowScale;
                  }
                  auVar76 = vminss_avx(ZEXT416((uint)(fVar93 + fVar93)),
                                       ZEXT416((uint)(((pIVar60->InnerRect).Max.x -
                                                      (pIVar60->InnerRect).Min.x) * 0.67)));
                  auVar125._0_4_ = (int)auVar76._0_4_;
                  auVar125._4_4_ = (int)auVar76._4_4_;
                  auVar125._8_4_ = (int)auVar76._8_4_;
                  auVar125._12_4_ = (int)auVar76._12_4_;
                  auVar76 = vcvtdq2ps_avx(auVar125);
                  auVar76 = vfnmadd213ss_fma(auVar76,ZEXT416((uint)fVar94),
                                             ZEXT416((uint)(pIVar60->Scroll).x));
                  (pIVar60->ScrollTarget).x = auVar76._0_4_;
                  (pIVar60->ScrollTargetCenterRatio).x = 0.0;
                  (pIVar60->ScrollTargetEdgeSnapDist).x = 0.0;
                }
              }
            }
          }
          else {
            if (pIVar56 != pIVar60) {
              pIVar49->WheelingWindow = pIVar60;
              pIVar49->WheelingWindowRefMousePos = (pIVar49->IO).MousePos;
              pIVar49->WheelingWindowTimer = 2.0;
            }
            fVar93 = pIVar60->FontWindowScale;
            auVar74 = vfmadd132ss_fma(ZEXT416((uint)(pIVar49->IO).MouseWheel),ZEXT416((uint)fVar93),
                                      ZEXT416(0x3dcccccd));
            auVar76 = vminss_avx(SUB6416(ZEXT464(0x40200000),0),auVar74);
            uVar40 = vcmpss_avx512f(auVar74,SUB6416(ZEXT464(0x3f000000),0),1);
            bVar68 = (bool)((byte)uVar40 & 1);
            fVar94 = (float)((uint)bVar68 * 0x3f000000 + (uint)!bVar68 * auVar76._0_4_);
            pIVar60->FontWindowScale = fVar94;
            if (pIVar60 == pIVar60->RootWindow) {
              fVar94 = fVar94 / fVar93;
              fVar93 = 1.0 - fVar94;
              IVar13 = pIVar60->Pos;
              auVar123._8_8_ = 0;
              auVar123._0_4_ = IVar13.x;
              auVar123._4_4_ = IVar13.y;
              IVar14 = pIVar60->Size;
              auVar133._8_8_ = 0;
              auVar133._0_4_ = IVar14.x;
              auVar133._4_4_ = IVar14.y;
              auVar138._8_8_ = 0;
              auVar138._0_4_ = (pIVar49->IO).MousePos.x;
              auVar138._4_4_ = (pIVar49->IO).MousePos.y;
              auVar76 = vsubps_avx(auVar138,auVar123);
              auVar112._0_4_ = fVar93 * IVar14.x * auVar76._0_4_;
              auVar112._4_4_ = fVar93 * IVar14.y * auVar76._4_4_;
              auVar112._8_4_ = fVar93 * 0.0 * auVar76._8_4_;
              auVar112._12_4_ = fVar93 * 0.0 * auVar76._12_4_;
              auVar76 = vdivps_avx(auVar112,auVar133);
              auVar113._0_4_ = IVar13.x + auVar76._0_4_;
              auVar113._4_4_ = IVar13.y + auVar76._4_4_;
              auVar113._8_4_ = auVar76._8_4_ + 0.0;
              auVar113._12_4_ = auVar76._12_4_ + 0.0;
              local_38 = (ImVec2)vmovlps_avx(auVar113);
              SetWindowPos(pIVar60,&local_38,0);
              auVar124._0_4_ = (int)(fVar94 * (pIVar60->Size).x);
              auVar124._4_4_ = (int)(fVar94 * (pIVar60->Size).y);
              auVar124._8_4_ = (int)(fVar94 * 0.0);
              auVar124._12_4_ = (int)(fVar94 * 0.0);
              auVar76 = vcvtdq2ps_avx(auVar124);
              auVar114._0_4_ = (int)(fVar94 * (pIVar60->SizeFull).x);
              auVar114._4_4_ = (int)(fVar94 * (pIVar60->SizeFull).y);
              auVar114._8_4_ = (int)(fVar94 * 0.0);
              auVar114._12_4_ = (int)(fVar94 * 0.0);
              auVar74 = vcvtdq2ps_avx(auVar114);
              auVar76 = vmovlhps_avx(auVar76,auVar74);
              (pIVar60->Size).x = (float)(int)auVar76._0_8_;
              (pIVar60->Size).y = (float)(int)((ulong)auVar76._0_8_ >> 0x20);
              (pIVar60->SizeFull).x = (float)(int)auVar76._8_8_;
              (pIVar60->SizeFull).y = (float)(int)((ulong)auVar76._8_8_ >> 0x20);
            }
          }
        }
      }
      if ((pIVar48->GcCompactAll == false) &&
         (fVar93 = (pIVar48->IO).ConfigMemoryCompactTimer, 0.0 <= fVar93)) {
        fVar118 = (float)pIVar48->Time - fVar93;
      }
      if ((pIVar48->Windows).Size != 0) {
        uVar73 = 0;
        do {
          pIVar56 = (pIVar48->Windows).Data[uVar73];
          bVar68 = pIVar56->Active;
          pIVar56->WasActive = bVar68;
          pIVar56->BeginCount = 0;
          pIVar56->Active = false;
          pIVar56->WriteAccessed = false;
          if (((bVar68 == false) && (pIVar56->MemoryCompacted == false)) &&
             (pIVar56->LastTimeActive < fVar118)) {
            GcCompactTransientWindowBuffers(pIVar56);
          }
          uVar73 = uVar73 + 1;
        } while (uVar73 != (uint)(pIVar48->Windows).Size);
      }
      if (0 < (pIVar48->TablesLastTimeActive).Size) {
        lVar66 = 0;
        lVar65 = 0;
        do {
          fVar93 = (pIVar48->TablesLastTimeActive).Data[lVar65];
          if ((0.0 <= fVar93) && (fVar93 < fVar118)) {
            TableGcCompactTransientBuffers
                      ((ImGuiTable *)((long)&((pIVar48->Tables).Buf.Data)->ID + lVar66));
          }
          lVar65 = lVar65 + 1;
          lVar66 = lVar66 + 0x208;
        } while (lVar65 < (pIVar48->TablesLastTimeActive).Size);
      }
      if (0 < (pIVar48->TablesTempData).Size) {
        lVar66 = 0;
        lVar65 = 0;
        do {
          pIVar22 = (pIVar48->TablesTempData).Data;
          fVar93 = *(float *)((long)&pIVar22->LastTimeActive + lVar66);
          if ((0.0 <= fVar93) && (fVar93 < fVar118)) {
            TableGcCompactTransientBuffers
                      ((ImGuiTableTempData *)((long)&pIVar22->TableIndex + lVar66));
          }
          lVar65 = lVar65 + 1;
          lVar66 = lVar66 + 0x70;
        } while (lVar65 < (pIVar48->TablesTempData).Size);
      }
      if (pIVar48->GcCompactAll != false) {
        GcCompactTransientMiscBuffers();
      }
      pIVar48->GcCompactAll = false;
      if ((pIVar48->NavWindow != (ImGuiWindow *)0x0) && (pIVar48->NavWindow->WasActive == false)) {
        FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
      }
      iVar62 = (pIVar48->CurrentWindowStack).Capacity;
      if (iVar62 < 0) {
        uVar58 = iVar62 / 2 + iVar62;
        uVar58 = ~((int)uVar58 >> 0x1f) & uVar58;
        if (GImGui != (ImGuiContext *)0x0) {
          piVar25 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar25 = *piVar25 + 1;
        }
        __dest_00 = (ImGuiWindowStackData *)
                    (*GImAllocatorAllocFunc)((ulong)uVar58 * 0x58,GImAllocatorUserData);
        pIVar23 = (pIVar48->CurrentWindowStack).Data;
        if (pIVar23 != (ImGuiWindowStackData *)0x0) {
          memcpy(__dest_00,pIVar23,(long)(pIVar48->CurrentWindowStack).Size * 0x58);
          pIVar23 = (pIVar48->CurrentWindowStack).Data;
          if ((pIVar23 != (ImGuiWindowStackData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar25 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar25 = *piVar25 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar23,GImAllocatorUserData);
        }
        (pIVar48->CurrentWindowStack).Data = __dest_00;
        (pIVar48->CurrentWindowStack).Capacity = uVar58;
      }
      (pIVar48->CurrentWindowStack).Size = 0;
      iVar62 = (pIVar48->BeginPopupStack).Capacity;
      if (iVar62 < 0) {
        uVar58 = iVar62 / 2 + iVar62;
        uVar58 = ~((int)uVar58 >> 0x1f) & uVar58;
        if (GImGui != (ImGuiContext *)0x0) {
          piVar25 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar25 = *piVar25 + 1;
        }
        __dest_01 = (ImGuiPopupData *)
                    (*GImAllocatorAllocFunc)((ulong)uVar58 * 0x30,GImAllocatorUserData);
        pIVar24 = (pIVar48->BeginPopupStack).Data;
        if (pIVar24 != (ImGuiPopupData *)0x0) {
          memcpy(__dest_01,pIVar24,(long)(pIVar48->BeginPopupStack).Size * 0x30);
          pIVar24 = (pIVar48->BeginPopupStack).Data;
          if ((pIVar24 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar25 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar25 = *piVar25 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar24,GImAllocatorUserData);
        }
        (pIVar48->BeginPopupStack).Data = __dest_01;
        (pIVar48->BeginPopupStack).Capacity = uVar58;
      }
      (pIVar48->BeginPopupStack).Size = 0;
      iVar62 = (pIVar48->ItemFlagsStack).Capacity;
      if (iVar62 < 0) {
        uVar58 = iVar62 / 2 + iVar62;
        uVar58 = ~((int)uVar58 >> 0x1f) & uVar58;
        if (GImGui != (ImGuiContext *)0x0) {
          piVar25 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar25 = *piVar25 + 1;
        }
        piVar57 = (int *)(*GImAllocatorAllocFunc)((ulong)uVar58 * 4,GImAllocatorUserData);
        piVar25 = (pIVar48->ItemFlagsStack).Data;
        if (piVar25 != (int *)0x0) {
          memcpy(piVar57,piVar25,(long)(pIVar48->ItemFlagsStack).Size << 2);
          piVar25 = (pIVar48->ItemFlagsStack).Data;
          if ((piVar25 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar4 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar4 = *piVar4 + -1;
          }
          (*GImAllocatorFreeFunc)(piVar25,GImAllocatorUserData);
        }
        (pIVar48->ItemFlagsStack).Data = piVar57;
        (pIVar48->ItemFlagsStack).Capacity = uVar58;
      }
      (pIVar48->ItemFlagsStack).Size = 0;
      if ((pIVar48->ItemFlagsStack).Capacity == 0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar25 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar25 = *piVar25 + 1;
        }
        piVar57 = (int *)(*GImAllocatorAllocFunc)(0x20,GImAllocatorUserData);
        piVar25 = (pIVar48->ItemFlagsStack).Data;
        if (piVar25 != (int *)0x0) {
          memcpy(piVar57,piVar25,(long)(pIVar48->ItemFlagsStack).Size << 2);
          piVar25 = (pIVar48->ItemFlagsStack).Data;
          if ((piVar25 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar4 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar4 = *piVar4 + -1;
          }
          (*GImAllocatorFreeFunc)(piVar25,GImAllocatorUserData);
        }
        (pIVar48->ItemFlagsStack).Data = piVar57;
        (pIVar48->ItemFlagsStack).Capacity = 8;
      }
      (pIVar48->ItemFlagsStack).Data[(pIVar48->ItemFlagsStack).Size] = 0;
      (pIVar48->ItemFlagsStack).Size = (pIVar48->ItemFlagsStack).Size + 1;
      iVar62 = (pIVar48->GroupStack).Capacity;
      if (iVar62 < 0) {
        uVar58 = iVar62 / 2 + iVar62;
        uVar58 = ~((int)uVar58 >> 0x1f) & uVar58;
        if (GImGui != (ImGuiContext *)0x0) {
          piVar25 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar25 = *piVar25 + 1;
        }
        __dest_02 = (ImGuiGroupData *)
                    (*GImAllocatorAllocFunc)((ulong)uVar58 * 0x30,GImAllocatorUserData);
        pIVar26 = (pIVar48->GroupStack).Data;
        if (pIVar26 != (ImGuiGroupData *)0x0) {
          memcpy(__dest_02,pIVar26,(long)(pIVar48->GroupStack).Size * 0x30);
          pIVar26 = (pIVar48->GroupStack).Data;
          if ((pIVar26 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar25 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar25 = *piVar25 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar26,GImAllocatorUserData);
        }
        (pIVar48->GroupStack).Data = __dest_02;
        (pIVar48->GroupStack).Capacity = uVar58;
      }
      (pIVar48->GroupStack).Size = 0;
      pIVar49 = GImGui;
      GImGui->DebugItemPickerBreakId = 0;
      if (pIVar49->DebugItemPickerActive == true) {
        uVar58 = pIVar49->HoveredIdPreviousFrame;
        pIVar49->MouseCursor = 7;
        iVar62 = (pIVar49->IO).KeyMap[0xe];
        if ((-1 < iVar62) && (bVar68 = IsKeyPressed(iVar62,true), bVar68)) {
          pIVar49->DebugItemPickerActive = false;
        }
        if (uVar58 != 0 && (pIVar49->IO).MouseDownDuration[0] == 0.0) {
          pIVar49->DebugItemPickerBreakId = uVar58;
          pIVar49->DebugItemPickerActive = false;
        }
        *(byte *)&(pIVar49->NextWindowData).Flags = (byte)(pIVar49->NextWindowData).Flags | 0x40;
        (pIVar49->NextWindowData).BgAlphaVal = 0.6;
        BeginTooltipEx(0,0);
        Text("HoveredId: 0x%08X",(ulong)uVar58);
        Text("Press ESC to abort picking.");
        TextColored((GImGui->Style).Colors + (uVar58 == 0),"Click to break in debugger!");
        End();
      }
      pIVar49 = GImGui;
      GImGui->DebugHookIdInfo = 0;
      if (pIVar49->FrameCount == (pIVar49->DebugStackTool).LastActiveFrame + 1) {
        IVar63 = pIVar49->HoveredIdPreviousFrame;
        if (IVar63 == 0) {
          IVar63 = pIVar49->ActiveId;
        }
        if ((pIVar49->DebugStackTool).QueryId != IVar63) {
          (pIVar49->DebugStackTool).QueryId = IVar63;
          (pIVar49->DebugStackTool).StackLevel = -1;
          iVar62 = (pIVar49->DebugStackTool).Results.Capacity;
          if (iVar62 < 0) {
            uVar58 = iVar62 / 2 + iVar62;
            uVar58 = ~((int)uVar58 >> 0x1f) & uVar58;
            if (pIVar49 != (ImGuiContext *)0x0) {
              piVar25 = &(pIVar49->IO).MetricsActiveAllocations;
              *piVar25 = *piVar25 + 1;
            }
            __dest_03 = (ImGuiStackLevelInfo *)
                        (*GImAllocatorAllocFunc)((ulong)uVar58 << 6,GImAllocatorUserData);
            pIVar27 = (pIVar49->DebugStackTool).Results.Data;
            if (pIVar27 != (ImGuiStackLevelInfo *)0x0) {
              memcpy(__dest_03,pIVar27,(long)(pIVar49->DebugStackTool).Results.Size << 6);
              pIVar27 = (pIVar49->DebugStackTool).Results.Data;
              if ((pIVar27 != (ImGuiStackLevelInfo *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                piVar25 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar25 = *piVar25 + -1;
              }
              (*GImAllocatorFreeFunc)(pIVar27,GImAllocatorUserData);
            }
            (pIVar49->DebugStackTool).Results.Data = __dest_03;
            (pIVar49->DebugStackTool).Results.Capacity = uVar58;
          }
          (pIVar49->DebugStackTool).Results.Size = 0;
        }
        if (IVar63 != 0) {
          iVar62 = (pIVar49->DebugStackTool).StackLevel;
          lVar66 = (long)iVar62;
          if (((-1 < lVar66) && (iVar62 < (pIVar49->DebugStackTool).Results.Size)) &&
             ((pIVar27 = (pIVar49->DebugStackTool).Results.Data,
              pIVar27[lVar66].QuerySuccess != false || ('\x02' < pIVar27[lVar66].QueryFrameCount))))
          {
            (pIVar49->DebugStackTool).StackLevel = iVar62 + 1;
          }
          uVar58 = (pIVar49->DebugStackTool).StackLevel;
          uVar73 = (ulong)uVar58;
          if (uVar73 == 0xffffffff) {
            pIVar49->DebugHookIdInfo = IVar63;
          }
          if ((-1 < (int)uVar58) && ((int)uVar58 < (pIVar49->DebugStackTool).Results.Size)) {
            pIVar27 = (pIVar49->DebugStackTool).Results.Data;
            pIVar49->DebugHookIdInfo = pIVar27[uVar73].ID;
            pIVar5 = &pIVar27[uVar73].QueryFrameCount;
            *pIVar5 = *pIVar5 + '\x01';
          }
        }
      }
      pIVar48->WithinFrameScopeWithImplicitWindow = true;
      pIVar49 = GImGui;
      (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
      (pIVar49->NextWindowData).SizeVal.x = 400.0;
      (pIVar49->NextWindowData).SizeVal.y = 400.0;
      (pIVar49->NextWindowData).SizeCond = 4;
      Begin("Debug##Default",(bool *)0x0,0);
      if (0 < (pIVar48->Hooks).Size) {
        lVar66 = 0;
        lVar65 = 0;
        do {
          pIVar18 = (pIVar48->Hooks).Data;
          if (*(int *)(pIVar18 + lVar66 + 4) == 1) {
            (**(code **)(pIVar18 + lVar66 + 0x10))(pIVar48,pIVar18 + lVar66);
          }
          lVar65 = lVar65 + 1;
          lVar66 = lVar66 + 0x20;
        } while (lVar65 < (pIVar48->Hooks).Size);
      }
      return;
    }
  } while( true );
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Close popups on focus lost (currently wip/opt-in)
    //if (g.IO.AppFocusLost)
    //    ClosePopupsExceptModals();

    // Clear buttons state when focus is lost
    // (this is useful so e.g. releasing Alt after focus loss on Alt-Tab doesn't trigger the Alt menu toggle)
    if (g.IO.AppFocusLost)
    {
        g.IO.ClearInputKeys();
        g.IO.AppFocusLost = false;
    }

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempData.Size; i++)
        if (g.TablesTempData[i].LastTimeActive >= 0.0f && g.TablesTempData[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempData[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);

    // [DEBUG] Update debug features
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}